

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrn_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::LRN_x86_avx512::forward_inplace(LRN_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [24];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [16];
  float fVar66;
  float fVar67;
  float fVar68;
  undefined4 uVar69;
  undefined1 (*in_RDX) [64];
  long *in_RSI;
  long in_RDI;
  undefined1 auVar70 [64];
  float fVar71;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  float val;
  int k;
  float ss;
  float *sptr_1;
  int j_1;
  int i_5;
  Mat m_6;
  float *ptr_3;
  int q_2;
  int j;
  int i_4;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  float alpha_div_size_1;
  int maxk;
  Option opt_b;
  int pad;
  Mat square_blob_bordered;
  int outh;
  int outw;
  __m256 _ssp_1;
  __m256 _p_1;
  __m256 _mb;
  __m256 _ads;
  __m256 _bias;
  int i_2;
  float *ssptr;
  float *ptr_2;
  __m256 _ssp;
  __m256 _sp;
  int i_3;
  float *ssptr_1;
  float *sptr;
  int p;
  int q_1;
  float alpha_div_size;
  Mat square_sum;
  __m256 _outp;
  __m256 _p;
  int i;
  float *outptr;
  float *ptr;
  int q;
  Mat square_blob;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *m_8;
  Mat *m_7;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  int i_1;
  float *ptr_1;
  int size_1;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx;
  __m256 tmp_1;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  allocator_type *in_stack_ffffffffffffd358;
  size_type in_stack_ffffffffffffd360;
  undefined4 in_stack_ffffffffffffd368;
  int in_stack_ffffffffffffd36c;
  int in_stack_ffffffffffffd370;
  int in_stack_ffffffffffffd374;
  undefined4 in_stack_ffffffffffffd378;
  float in_stack_ffffffffffffd37c;
  undefined8 in_stack_ffffffffffffd380;
  void **ppvVar79;
  int in_stack_ffffffffffffd388;
  int in_stack_ffffffffffffd38c;
  Mat *in_stack_ffffffffffffd390;
  Mat *in_stack_ffffffffffffd398;
  int in_stack_ffffffffffffd3a8;
  Option *in_stack_ffffffffffffd3b0;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 local_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  bool local_25c9;
  bool local_2511;
  int local_24f8;
  float local_24f4;
  int local_24e8;
  int local_24e4;
  void *local_24e0;
  int *local_24d8;
  ulong local_24d0;
  undefined4 local_24c8;
  long *local_24c0;
  int local_24b8;
  int local_24b4;
  int local_24b0;
  undefined4 local_24ac;
  undefined4 local_24a8;
  ulong local_24a0;
  undefined8 local_2498;
  undefined8 local_2490;
  undefined8 local_2488;
  undefined4 local_2480;
  long local_2478;
  undefined4 local_2470;
  undefined4 local_246c;
  undefined4 local_2468;
  undefined4 local_2464;
  undefined4 local_2460;
  undefined8 local_2458;
  long local_2450;
  int local_2448;
  int local_2444;
  int local_2440;
  int local_243c;
  int local_2438;
  int local_2434;
  reference local_2430;
  vector<int,_std::allocator<int>_> local_2420;
  float local_2408;
  int local_2404;
  undefined1 local_2400 [108];
  int local_2394;
  void *local_2390;
  int *local_2388;
  ulong local_2380;
  undefined4 local_2378;
  long *local_2370;
  int local_2368;
  int local_2364;
  int local_2360;
  undefined4 local_235c;
  int local_2358;
  long local_2350;
  int local_2348;
  int local_2344;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined1 local_2300 [32];
  undefined8 local_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  undefined8 local_22c0;
  undefined8 uStack_22b8;
  undefined8 uStack_22b0;
  undefined8 uStack_22a8;
  int local_2284;
  undefined8 local_2280;
  undefined8 local_2278;
  undefined8 local_2270;
  undefined4 local_2268;
  long *local_2260;
  undefined4 local_2258;
  undefined4 local_2254;
  undefined4 local_2250;
  undefined4 local_224c;
  undefined4 local_2248;
  undefined8 local_2240;
  float *local_2238;
  undefined8 local_2230;
  undefined8 local_2228;
  undefined8 local_2220;
  undefined4 local_2218;
  long local_2210;
  undefined4 local_2208;
  undefined4 local_2204;
  undefined4 local_2200;
  undefined4 local_21fc;
  undefined4 local_21f8;
  undefined8 local_21f0;
  undefined1 (*local_21e8) [32];
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  int local_219c;
  undefined8 local_2198;
  undefined8 local_2190;
  undefined8 local_2188;
  undefined4 local_2180;
  long *local_2178;
  undefined4 local_2170;
  undefined4 local_216c;
  undefined4 local_2168;
  undefined4 local_2164;
  undefined4 local_2160;
  undefined8 local_2158;
  undefined1 (*local_2150) [32];
  undefined8 local_2148;
  undefined8 local_2140;
  undefined8 local_2138;
  undefined4 local_2130;
  long *local_2128;
  undefined4 local_2120;
  undefined4 local_211c;
  undefined4 local_2118;
  undefined4 local_2114;
  undefined4 local_2110;
  undefined8 local_2108;
  float *local_2100;
  int local_20f4;
  int local_20f0;
  float local_20ec;
  undefined4 *local_20e8;
  int *local_20e0;
  long local_20d8;
  undefined4 local_20d0;
  long *local_20c8;
  undefined4 local_20c0;
  int local_20bc;
  int local_20b8;
  undefined4 local_20b4;
  int local_20b0;
  long local_20a8;
  undefined8 local_20a0;
  undefined8 uStack_2098;
  undefined8 uStack_2090;
  undefined8 uStack_2088;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  int local_205c;
  undefined8 local_2058;
  undefined8 local_2050;
  undefined8 local_2048;
  undefined4 local_2040;
  long *local_2038;
  undefined4 local_2030;
  undefined4 local_202c;
  undefined4 local_2028;
  undefined4 local_2024;
  undefined4 local_2020;
  undefined8 local_2018;
  undefined1 (*local_2010) [32];
  undefined8 local_2008;
  undefined8 local_2000;
  undefined8 local_1ff8;
  undefined4 local_1ff0;
  long local_1fe8;
  undefined4 local_1fe0;
  undefined4 local_1fdc;
  undefined4 local_1fd8;
  undefined4 local_1fd4;
  undefined4 local_1fd0;
  undefined8 local_1fc8;
  undefined1 (*local_1fc0) [32];
  int local_1fb4;
  int local_1fb0;
  void *local_1fa0;
  int *local_1f98;
  ulong local_1f90;
  undefined4 local_1f88;
  long *local_1f80;
  int local_1f78;
  int local_1f74;
  int local_1f70;
  undefined4 local_1f6c;
  int local_1f68;
  long local_1f60;
  int local_1f54;
  long local_1f50;
  int local_1f44;
  int local_1f40;
  int local_1f3c;
  undefined1 (*local_1f38) [64];
  long *local_1f30;
  int local_1f1c;
  void **local_1f18;
  undefined4 **local_1f10;
  void **local_1f08;
  undefined4 **local_1f00;
  void **local_1ef8;
  undefined1 local_1eed;
  int local_1eec;
  void **local_1ee8;
  void **local_1ee0;
  undefined1 local_1ed5;
  int local_1ed4;
  undefined8 *local_1ec8;
  undefined1 local_1ebd;
  int local_1ebc;
  undefined4 **local_1eb8;
  undefined8 *local_1eb0;
  undefined1 local_1ea5;
  int local_1ea4;
  undefined8 *local_1e98;
  undefined1 local_1e8d;
  int local_1e8c;
  undefined4 **local_1e88;
  undefined8 *local_1e80;
  undefined1 local_1e75;
  int local_1e74;
  void **local_1e70;
  undefined8 *local_1e68;
  undefined1 local_1e5d;
  int local_1e5c;
  void **local_1e58;
  undefined8 *local_1e50;
  undefined1 local_1e45;
  int local_1e44;
  undefined8 *local_1e38;
  undefined8 *local_1e30;
  undefined8 *local_1e28;
  undefined8 *local_1de0;
  undefined8 *local_1dd0;
  undefined8 *local_1dc0;
  undefined8 *local_1db0;
  undefined8 *local_1da0;
  undefined8 *local_1d90;
  undefined4 **local_1d80;
  undefined8 *local_1d70;
  void **local_1d60;
  void **local_1d50;
  void **local_1d40;
  undefined8 *local_1d30;
  undefined8 *local_1d28;
  undefined8 *local_1d20;
  undefined8 *local_1d18;
  undefined8 *local_1d10;
  float *local_1d08;
  undefined1 (*local_1d00) [32];
  undefined1 (*local_1cf8) [32];
  float *local_1cf0;
  undefined1 (*local_1ce8) [32];
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined1 local_1c40 [8];
  float fStack_1c38;
  float fStack_1c34;
  float fStack_1c30;
  float fStack_1c2c;
  float fStack_1c28;
  undefined4 uStack_1c24;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined1 (*local_1be8) [32];
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined1 (*local_1ba8) [32];
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  undefined1 (*local_1b68) [32];
  int local_1b5c;
  undefined4 *local_1b58;
  int local_1b50;
  undefined4 local_1b4c;
  undefined4 **local_1b48;
  undefined8 local_1b40;
  undefined8 uStack_1b38;
  undefined8 uStack_1b30;
  undefined8 uStack_1b28;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  uint local_1aac;
  float local_1aa8;
  uint local_1aa4;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  undefined8 local_1a80;
  undefined8 uStack_1a78;
  undefined8 uStack_1a70;
  undefined8 uStack_1a68;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  void **local_1a10;
  void **local_1a08;
  int local_19fc;
  void **local_19f8;
  undefined4 **local_19f0;
  void **local_19e8;
  undefined4 **local_19e0;
  void **local_19d8;
  long local_19d0;
  undefined4 local_19c4;
  long local_19c0;
  undefined1 (*local_19b8) [32];
  undefined4 local_19ac;
  int local_19a8;
  int local_19a4;
  undefined8 *local_19a0;
  long *local_1998;
  undefined4 local_198c;
  ulong local_1988;
  undefined1 (*local_1980) [32];
  undefined4 local_1974;
  int local_1970;
  int local_196c;
  undefined8 *local_1968;
  long *local_1960;
  undefined4 local_1954;
  ulong local_1950;
  float *local_1948;
  undefined4 local_193c;
  int local_1938;
  int local_1934;
  undefined8 *local_1930;
  long *local_1928;
  undefined4 local_191c;
  long local_1918;
  undefined1 (*local_1910) [32];
  undefined4 local_1904;
  int local_1900;
  int local_18fc;
  undefined8 *local_18f8;
  long local_18f0;
  undefined4 local_18e4;
  long local_18e0;
  undefined1 (*local_18d8) [32];
  undefined4 local_18cc;
  int local_18c8;
  int local_18c4;
  undefined8 *local_18c0;
  long *local_18b8;
  undefined4 local_18ac;
  long local_18a8;
  float *local_18a0;
  undefined4 local_1894;
  int local_1890;
  int local_188c;
  undefined8 *local_1888;
  long local_1880;
  undefined4 local_1874;
  long local_1870;
  long local_1868;
  undefined4 local_185c;
  int local_1858;
  int local_1854;
  undefined8 *local_1850;
  long *local_1848;
  undefined4 local_183c;
  ulong local_1838;
  void *local_1830;
  undefined4 local_1824;
  void **local_1818;
  undefined4 local_180c;
  long local_1808;
  undefined4 local_17fc;
  long local_17f8;
  undefined4 local_17ec;
  long local_17e8;
  undefined4 local_17dc;
  long local_17d8;
  undefined4 local_17cc;
  long local_17c8;
  undefined4 local_17bc;
  long local_17b8;
  undefined4 local_17ac;
  long local_17a8;
  undefined4 local_179c;
  long local_1798;
  int local_1780;
  undefined4 local_177c;
  void **local_1778;
  int local_1760;
  undefined4 local_175c;
  void **local_1758;
  int local_1740;
  undefined4 local_173c;
  void **local_1738;
  undefined8 *local_1718;
  int local_1700;
  undefined4 local_16fc;
  undefined4 **local_16f8;
  undefined8 *local_16d8;
  undefined8 *local_16b8;
  undefined8 *local_1698;
  undefined8 *local_1678;
  undefined8 *local_1658;
  undefined8 *local_1638;
  undefined4 *local_1510;
  void *local_14f0;
  void *local_14e0;
  void *local_14d0;
  undefined1 local_14c0 [32];
  uint local_14a0;
  uint local_149c;
  uint local_1498;
  uint local_1494;
  uint local_1490;
  uint local_148c;
  uint local_1488;
  uint local_1484;
  undefined1 local_1480 [32];
  float local_1460;
  float local_145c;
  float local_1458;
  float local_1454;
  float local_1450;
  float local_144c;
  float local_1448;
  float local_1444;
  undefined1 local_1440 [32];
  uint local_1420;
  uint local_141c;
  uint local_1418;
  uint local_1414;
  uint local_1410;
  uint local_140c;
  uint local_1408;
  uint local_1404;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined1 local_13c0 [32];
  undefined4 local_13a0;
  undefined4 uStack_139c;
  undefined4 uStack_1398;
  undefined4 uStack_1394;
  undefined4 uStack_1390;
  undefined4 uStack_138c;
  undefined4 uStack_1388;
  undefined4 uStack_1384;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined1 local_1360 [32];
  undefined1 local_1340 [8];
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined1 local_1320 [8];
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 uStack_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined1 local_1240 [8];
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  float local_1220;
  float fStack_121c;
  float fStack_1218;
  float fStack_1214;
  float fStack_1210;
  float fStack_120c;
  float fStack_1208;
  float fStack_1204;
  undefined1 local_1200 [32];
  undefined1 local_11e0 [32];
  undefined1 local_11c0 [8];
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined1 local_11a0 [32];
  undefined4 local_1180;
  undefined4 uStack_117c;
  undefined4 uStack_1178;
  undefined4 uStack_1174;
  undefined4 uStack_1170;
  undefined4 uStack_116c;
  undefined4 uStack_1168;
  undefined4 uStack_1164;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined1 local_1140 [8];
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  ulong uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined4 local_f60;
  undefined4 uStack_f5c;
  undefined4 uStack_f58;
  undefined4 uStack_f54;
  undefined4 uStack_f50;
  undefined4 uStack_f4c;
  undefined4 uStack_f48;
  undefined4 uStack_f44;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined4 local_f20;
  undefined4 uStack_f1c;
  undefined4 uStack_f18;
  undefined4 uStack_f14;
  undefined4 uStack_f10;
  undefined4 uStack_f0c;
  undefined4 uStack_f08;
  undefined4 uStack_f04;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined4 local_ee0;
  undefined4 uStack_edc;
  undefined4 uStack_ed8;
  undefined4 uStack_ed4;
  undefined4 uStack_ed0;
  undefined4 uStack_ecc;
  undefined4 uStack_ec8;
  undefined4 uStack_ec4;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined1 *local_e98;
  float *local_e90;
  undefined1 *local_e88;
  undefined1 *local_e80;
  float *local_e78;
  undefined1 *local_e70;
  float *local_e68;
  undefined1 *local_e60;
  undefined1 *local_e58;
  float *local_e50;
  undefined1 *local_e48;
  undefined1 *local_e40;
  float *local_e38;
  undefined1 *local_e30;
  undefined1 *local_e28;
  float *local_e20;
  undefined1 *local_e18;
  undefined1 *local_e10;
  float *local_e08;
  undefined1 *local_e00;
  undefined1 *local_df8;
  float *local_df0;
  undefined1 *local_de8;
  undefined1 *local_de0;
  float *local_dd8;
  undefined1 *local_dd0;
  undefined1 *local_dc8;
  float *local_dc0;
  undefined1 *local_db8;
  undefined1 *local_db0;
  undefined1 *local_da8;
  undefined1 *local_da0;
  undefined8 *local_d98;
  float *local_d90;
  undefined1 *local_d88;
  undefined8 *local_d80;
  float *local_d78;
  undefined1 *local_d70;
  undefined8 *local_d68;
  float *local_d60;
  undefined1 *local_d58;
  undefined8 *local_d50;
  float *local_d48;
  undefined1 *local_d40;
  undefined8 *local_d38;
  float *local_d30;
  undefined1 *local_d28;
  undefined8 *local_d20;
  float *local_d18;
  float *local_d10;
  undefined1 *local_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined4 local_c80;
  undefined4 uStack_c7c;
  undefined4 uStack_c78;
  undefined4 uStack_c74;
  undefined4 uStack_c70;
  undefined4 uStack_c6c;
  undefined4 uStack_c68;
  undefined4 uStack_c64;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined1 local_c00 [32];
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined1 *local_b28;
  float *local_b20;
  float *local_b18;
  undefined1 *local_b10;
  float *local_b08;
  undefined1 *local_b00;
  undefined1 *local_af8;
  float *local_af0;
  undefined1 *local_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined4 local_a64;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  float local_a20 [2];
  float afStack_a18 [2];
  float afStack_a10 [2];
  float afStack_a08 [2];
  float local_a00 [2];
  float afStack_9f8 [2];
  float afStack_9f0 [2];
  float afStack_9e8 [2];
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  float local_9c0 [2];
  float afStack_9b8 [2];
  float afStack_9b0 [2];
  float afStack_9a8 [2];
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  float local_960 [2];
  float afStack_958 [2];
  float afStack_950 [2];
  float afStack_948 [2];
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  float local_900 [2];
  float afStack_8f8 [2];
  float afStack_8f0 [2];
  float afStack_8e8 [2];
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  float local_8a0 [2];
  float afStack_898 [2];
  float afStack_890 [2];
  float afStack_888 [2];
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  float local_840 [2];
  float afStack_838 [2];
  float afStack_830 [2];
  float afStack_828 [2];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  float local_780 [2];
  float afStack_778 [2];
  float afStack_770 [2];
  float afStack_768 [2];
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  float local_720 [2];
  float afStack_718 [2];
  float afStack_710 [2];
  float afStack_708 [2];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  float local_6c0 [2];
  float afStack_6b8 [2];
  float afStack_6b0 [2];
  float afStack_6a8 [2];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  float local_660 [2];
  float afStack_658 [2];
  float afStack_650 [2];
  float afStack_648 [2];
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  float local_600 [2];
  float afStack_5f8 [2];
  float afStack_5f0 [2];
  float afStack_5e8 [2];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  float local_5a0 [2];
  float afStack_598 [2];
  float afStack_590 [2];
  float afStack_588 [2];
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  float local_540 [2];
  float afStack_538 [2];
  float afStack_530 [2];
  float afStack_528 [2];
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  float local_4e0 [2];
  float afStack_4d8 [2];
  float afStack_4d0 [2];
  float afStack_4c8 [2];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  ulong uStack_468;
  float local_460 [2];
  float afStack_458 [2];
  float afStack_450 [2];
  float afStack_448 [2];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  float local_400 [2];
  float afStack_3f8 [2];
  float afStack_3f0 [2];
  float afStack_3e8 [2];
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  float local_3a0 [2];
  float afStack_398 [2];
  float afStack_390 [2];
  float afStack_388 [2];
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  float local_340 [2];
  float afStack_338 [2];
  float afStack_330 [2];
  float afStack_328 [2];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  float local_2e0 [2];
  float afStack_2d8 [2];
  float afStack_2d0 [2];
  float afStack_2c8 [2];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined4 local_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined4 local_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined4 local_180;
  undefined4 uStack_17c;
  undefined4 uStack_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined4 local_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  int local_60;
  undefined4 local_5c;
  void **local_58;
  
  local_1f3c = *(int *)((long)in_RSI + 0x2c);
  local_1f40 = (int)in_RSI[6];
  local_1f44 = (int)in_RSI[7];
  local_1f50 = in_RSI[2];
  local_1f54 = local_1f3c * local_1f40;
  local_1f18 = &local_1fa0;
  local_1fa0 = (void *)0x0;
  local_1f98 = (int *)0x0;
  local_1f90 = 0;
  local_1f88 = 0;
  local_1f80 = (long *)0x0;
  local_1f78 = 0;
  local_1f74 = 0;
  local_1f70 = 0;
  local_1f6c = 0;
  local_1f68 = 0;
  local_1f60 = 0;
  local_1f38 = in_RDX;
  local_1f30 = in_RSI;
  Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffd37c,in_stack_ffffffffffffd378),
              in_stack_ffffffffffffd374,in_stack_ffffffffffffd370,in_stack_ffffffffffffd36c,
              in_stack_ffffffffffffd360,(Allocator *)in_stack_ffffffffffffd358);
  uVar15 = uStack_13c8;
  uVar14 = uStack_13d0;
  uVar13 = uStack_13d8;
  uVar12 = local_13e0;
  local_1ef8 = &local_1fa0;
  if (local_1fa0 != (void *)0x0) {
    local_19e8 = local_1ef8;
  }
  local_2511 = local_1fa0 == (void *)0x0 || local_1f60 * local_1f68 == 0;
  if (local_2511) {
    local_1f1c = -100;
    local_1fb0 = 1;
    goto LAB_00f485d4;
  }
  for (local_1fb4 = 0; local_1fb4 < local_1f44; local_1fb4 = local_1fb4 + 1) {
    local_1e38 = &local_2008;
    local_19a4 = *(int *)((long)local_1f30 + 0x2c);
    local_19a8 = (int)local_1f30[6];
    local_19ac = *(undefined4 *)((long)local_1f30 + 0x34);
    local_19b8 = (undefined1 (*) [32])
                 (*local_1f30 + local_1f30[8] * (long)local_1fb4 * local_1f30[2]);
    local_19c0 = local_1f30[2];
    local_19c4 = (undefined4)local_1f30[3];
    local_19d0 = local_1f30[4];
    local_19a0 = &local_2008;
    local_1798 = (long)local_19a4 * (long)local_19a8 * local_19c0;
    local_1e28 = &local_2008;
    local_1de0 = &local_2008;
    local_179c = 0x10;
    local_1e44 = local_1fb4;
    local_1e45 = 1;
    local_2008 = 0;
    local_1ff8 = 0;
    local_1ff0 = 0;
    local_1fdc = 0;
    local_1fd8 = 0;
    local_1fd4 = 0;
    local_1fd0 = 0;
    local_2000 = 0;
    local_1e50 = &local_2058;
    local_1e58 = &local_1fa0;
    local_1980 = (undefined1 (*) [32])((long)local_1fa0 + local_1f60 * local_1fb4 * local_1f90);
    local_1968 = &local_2058;
    local_2038 = local_1f80;
    local_17a8 = (long)local_1f74 * (long)local_1f70 * local_1f90;
    uStack_13c8._4_4_ = SUB84(uVar15,4);
    uStack_13d0._4_4_ = SUB84(uVar14,4);
    uStack_13d8._4_4_ = SUB84(uVar13,4);
    local_13e0._4_4_ = SUB84(uVar12,4);
    local_17ac = 0x10;
    local_196c = local_1f74;
    local_1970 = local_1f70;
    local_1974 = local_1f6c;
    local_1988 = local_1f90;
    local_198c = local_1f88;
    local_1998 = local_1f80;
    local_1e5c = local_1fb4;
    local_1e5d = 1;
    local_1fc8 = 0;
    local_1fe0 = 0;
    local_1d10 = &local_2058;
    local_1dd0 = &local_2058;
    local_2058 = 0;
    local_2048 = 0;
    local_2040 = 0;
    local_2030 = 0;
    local_202c = 0;
    local_2028 = 0;
    local_2024 = 0;
    local_2020 = 0;
    local_2018 = 0;
    local_2050 = 0;
    local_2010 = local_1980;
    local_1fc0 = local_19b8;
    for (local_205c = 0; local_205c + 7 < local_1f54; local_205c = local_205c + 8) {
      local_1ce8 = local_1fc0;
      local_2080 = *(undefined8 *)*local_1fc0;
      uStack_2078 = *(undefined8 *)(*local_1fc0 + 8);
      uStack_2070 = *(undefined8 *)(*local_1fc0 + 0x10);
      auVar62 = *(undefined1 (*) [24])*local_1fc0;
      uStack_2068 = *(undefined8 *)(*local_1fc0 + 0x18);
      auVar9 = *local_1fc0;
      local_1c40._0_4_ = auVar62._0_4_;
      local_1c40._4_4_ = auVar62._4_4_;
      fStack_1c38 = auVar62._8_4_;
      fStack_1c34 = auVar62._12_4_;
      fStack_1c30 = auVar62._16_4_;
      fStack_1c2c = auVar62._20_4_;
      fStack_1c28 = (float)uStack_2068;
      uStack_1c24 = (undefined4)((ulong)uStack_2068 >> 0x20);
      local_1c60._0_4_ = (float)local_2080;
      local_1c60._4_4_ = (float)((ulong)local_2080 >> 0x20);
      uStack_1c58._0_4_ = (float)uStack_2078;
      uStack_1c58._4_4_ = (float)((ulong)uStack_2078 >> 0x20);
      uStack_1c50._0_4_ = (float)uStack_2070;
      uStack_1c50._4_4_ = (float)((ulong)uStack_2070 >> 0x20);
      local_20a0 = CONCAT44((float)local_1c40._4_4_ * local_1c60._4_4_,
                            (float)local_1c40._0_4_ * (float)local_1c60);
      uStack_2098 = CONCAT44(fStack_1c34 * uStack_1c58._4_4_,fStack_1c38 * (float)uStack_1c58);
      uStack_2090 = CONCAT44(fStack_1c2c * uStack_1c50._4_4_,fStack_1c30 * (float)uStack_1c50);
      uStack_2088 = CONCAT44(uStack_1c24,fStack_1c28 * fStack_1c28);
      local_1b68 = local_2010;
      auVar8._8_8_ = uStack_2098;
      auVar8._0_8_ = local_20a0;
      auVar8._16_8_ = uStack_2090;
      auVar8._24_8_ = uStack_2088;
      *local_2010 = auVar8;
      local_1fc0 = local_1fc0 + 1;
      local_2010 = local_2010 + 1;
      local_1c60 = local_2080;
      uStack_1c58 = uStack_2078;
      uStack_1c50 = uStack_2070;
      uStack_1c48 = uStack_2068;
      _local_1c40 = auVar9;
      local_1ba0 = local_20a0;
      uStack_1b98 = uStack_2098;
      uStack_1b90 = uStack_2090;
      uStack_1b88 = uStack_2088;
    }
    for (; local_205c < local_1f54; local_205c = local_205c + 1) {
      *(float *)*local_2010 = *(float *)*local_1fc0 * *(float *)*local_1fc0;
      local_1fc0 = (undefined1 (*) [32])(*local_1fc0 + 4);
      local_2010 = (undefined1 (*) [32])(*local_2010 + 4);
    }
    local_1658 = local_1dd0;
    local_1638 = local_1de0;
    local_1fe8 = local_19d0;
  }
  if (*(int *)(in_RDI + 0xd0) == 0) {
    local_1f10 = &local_20e8;
    local_20e8 = (undefined4 *)0x0;
    local_20e0 = (int *)0x0;
    local_20d8 = 0;
    local_20d0 = 0;
    local_20c8 = (long *)0x0;
    local_20c0 = 0;
    local_20bc = 0;
    local_20b8 = 0;
    local_20b4 = 0;
    local_20b0 = 0;
    local_20a8 = 0;
    Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffd37c,in_stack_ffffffffffffd378),
                in_stack_ffffffffffffd374,in_stack_ffffffffffffd370,in_stack_ffffffffffffd36c,
                in_stack_ffffffffffffd360,(Allocator *)in_stack_ffffffffffffd358);
    uStack_13c8 = uVar15;
    uStack_13d0 = uVar14;
    uStack_13d8 = uVar13;
    local_13e0 = uVar12;
    uVar15 = uStack_13c8;
    uVar14 = uStack_13d0;
    uVar13 = uStack_13d8;
    uVar12 = local_13e0;
    local_1f00 = &local_20e8;
    if (local_20e8 != (undefined4 *)0x0) {
      local_19e0 = local_1f00;
    }
    local_25c9 = local_20e8 != (undefined4 *)0x0 && local_20a8 * local_20b0 != 0;
    if (local_25c9) {
      local_1b48 = &local_20e8;
      local_1b4c = 0;
      local_1b50 = (int)local_20a8 * local_20b0;
      local_1b58 = local_20e8;
      for (local_1b5c = 0; local_1b5c < local_1b50; local_1b5c = local_1b5c + 1) {
        *local_1b58 = 0;
        local_1b58 = local_1b58 + 1;
      }
      local_20ec = *(float *)(in_RDI + 0xd8) / (float)*(int *)(in_RDI + 0xd4);
      local_19f0 = local_1b48;
      for (local_20f0 = 0; uStack_13c8 = uVar15, uStack_13d0 = uVar14, uStack_13d8 = uVar13,
          local_13e0 = uVar12, uVar69 = uStack_13c8._4_4_, fVar68 = uStack_13d0._4_4_,
          fVar67 = uStack_13d8._4_4_, fVar66 = local_13e0._4_4_, local_20f0 < local_1f44;
          local_20f0 = local_20f0 + 1) {
        for (local_20f4 = local_20f0 - *(int *)(in_RDI + 0xd4) / 2;
            local_20f4 <= local_20f0 + *(int *)(in_RDI + 0xd4) / 2; local_20f4 = local_20f4 + 1) {
          if ((-1 < local_20f4) && (local_20f4 < local_1f44)) {
            local_1e68 = &local_2148;
            local_1e70 = &local_1fa0;
            local_1948 = (float *)((long)local_1fa0 + local_1f60 * local_20f4 * local_1f90);
            local_1930 = &local_2148;
            local_17b8 = (long)local_1f74 * (long)local_1f70 * local_1f90;
            local_1e30 = &local_2148;
            local_1dc0 = &local_2148;
            local_1e80 = &local_2198;
            local_1e88 = &local_20e8;
            local_1910 = (undefined1 (*) [32])
                         ((long)local_20e8 + local_20a8 * local_20f0 * local_20d8);
            local_18f8 = &local_2198;
            local_17c8 = (long)local_20bc * (long)local_20b8 * local_20d8;
            local_1d18 = &local_2198;
            local_1db0 = &local_2198;
            local_2110 = 0;
            local_2114 = 0;
            local_2118 = 0;
            local_211c = 0;
            local_2128 = local_1f80;
            local_2130 = 0;
            local_2138 = 0;
            local_2140 = 0;
            local_2148 = 0;
            local_2178 = local_20c8;
            local_17bc = 0x10;
            local_17cc = 0x10;
            local_18fc = local_20bc;
            local_1900 = local_20b8;
            local_1904 = local_20b4;
            local_1918 = local_20d8;
            local_191c = local_20d0;
            local_1928 = local_20c8;
            local_1934 = local_1f74;
            local_1938 = local_1f70;
            local_193c = local_1f6c;
            local_1950 = local_1f90;
            local_1954 = local_1f88;
            local_1960 = local_1f80;
            local_1e74 = local_20f4;
            local_1e75 = 1;
            local_1e8c = local_20f0;
            local_1e8d = 1;
            local_2108 = 0;
            local_2120 = 0;
            local_2198 = 0;
            local_2188 = 0;
            local_2180 = 0;
            local_2170 = 0;
            local_216c = 0;
            local_2168 = 0;
            local_2164 = 0;
            local_2160 = 0;
            local_2158 = 0;
            local_2190 = 0;
            local_2150 = local_1910;
            local_2100 = local_1948;
            for (local_219c = 0; local_219c + 7 < local_1f54; local_219c = local_219c + 8) {
              local_1cf0 = local_2100;
              local_21c0 = *(undefined8 *)local_2100;
              uStack_21b8 = *(undefined8 *)(local_2100 + 2);
              uStack_21b0 = *(undefined8 *)(local_2100 + 4);
              uStack_21a8 = *(undefined8 *)(local_2100 + 6);
              local_1cf8 = local_2150;
              uVar12 = *(undefined8 *)*local_2150;
              uVar13 = *(undefined8 *)((long)*local_2150 + 8);
              uVar14 = *(undefined8 *)((long)*local_2150 + 0x10);
              uVar15 = *(undefined8 *)((long)*local_2150 + 0x18);
              local_1ae0._0_4_ = (float)uVar12;
              local_1ae0._4_4_ = (float)((ulong)uVar12 >> 0x20);
              uStack_1ad8._0_4_ = (float)uVar13;
              uStack_1ad8._4_4_ = (float)((ulong)uVar13 >> 0x20);
              uStack_1ad0._0_4_ = (float)uVar14;
              uStack_1ad0._4_4_ = (float)((ulong)uVar14 >> 0x20);
              uStack_1ac8._0_4_ = (float)uVar15;
              uStack_1ac8._4_4_ = (float)((ulong)uVar15 >> 0x20);
              local_1b00._0_4_ = (float)local_21c0;
              local_1b00._4_4_ = (float)((ulong)local_21c0 >> 0x20);
              uStack_1af8._0_4_ = (float)uStack_21b8;
              uStack_1af8._4_4_ = (float)((ulong)uStack_21b8 >> 0x20);
              uStack_1af0._0_4_ = (float)uStack_21b0;
              uStack_1af0._4_4_ = (float)((ulong)uStack_21b0 >> 0x20);
              uStack_1ae8._0_4_ = (float)uStack_21a8;
              uStack_1ae8._4_4_ = (float)((ulong)uStack_21a8 >> 0x20);
              local_21e0 = CONCAT44(local_1ae0._4_4_ + local_1b00._4_4_,
                                    (float)local_1ae0 + (float)local_1b00);
              uStack_21d8 = CONCAT44(uStack_1ad8._4_4_ + uStack_1af8._4_4_,
                                     (float)uStack_1ad8 + (float)uStack_1af8);
              uStack_21d0 = CONCAT44(uStack_1ad0._4_4_ + uStack_1af0._4_4_,
                                     (float)uStack_1ad0 + (float)uStack_1af0);
              uStack_21c8 = CONCAT44(uStack_1ac8._4_4_ + uStack_1ae8._4_4_,
                                     (float)uStack_1ac8 + (float)uStack_1ae8);
              local_1ba8 = local_2150;
              auVar9._8_8_ = uStack_21d8;
              auVar9._0_8_ = local_21e0;
              auVar9._16_8_ = uStack_21d0;
              auVar9._24_8_ = uStack_21c8;
              *local_2150 = auVar9;
              local_2100 = local_2100 + 8;
              local_2150 = local_2150 + 1;
              local_1be0 = local_21e0;
              uStack_1bd8 = uStack_21d8;
              uStack_1bd0 = uStack_21d0;
              uStack_1bc8 = uStack_21c8;
              local_1b00 = local_21c0;
              uStack_1af8 = uStack_21b8;
              uStack_1af0 = uStack_21b0;
              uStack_1ae8 = uStack_21a8;
              local_1ae0 = uVar12;
              uStack_1ad8 = uVar13;
              uStack_1ad0 = uVar14;
              uStack_1ac8 = uVar15;
            }
            for (; local_1698 = local_1db0, local_1678 = local_1dc0, local_219c < local_1f54;
                local_219c = local_219c + 1) {
              *(float *)*local_2150 = *local_2100 + *(float *)*local_2150;
              local_2100 = local_2100 + 1;
              local_2150 = (undefined1 (*) [32])((long)*local_2150 + 4);
            }
          }
        }
        local_1e98 = &local_2230;
        local_18c4 = *(int *)((long)local_1f30 + 0x2c);
        local_18c8 = (int)local_1f30[6];
        local_18cc = *(undefined4 *)((long)local_1f30 + 0x34);
        local_18d8 = (undefined1 (*) [32])
                     (*local_1f30 + local_1f30[8] * (long)local_20f0 * local_1f30[2]);
        local_18e0 = local_1f30[2];
        local_18e4 = (undefined4)local_1f30[3];
        local_18f0 = local_1f30[4];
        local_18c0 = &local_2230;
        local_17d8 = (long)local_18c4 * (long)local_18c8 * local_18e0;
        local_1d20 = &local_2230;
        local_1da0 = &local_2230;
        local_1eb0 = &local_2280;
        local_1eb8 = &local_20e8;
        local_18a0 = (float *)((long)local_20e8 + local_20a8 * local_20f0 * local_20d8);
        local_1888 = &local_2280;
        local_17e8 = (long)local_20bc * (long)local_20b8 * local_20d8;
        local_1d28 = &local_2280;
        local_1d90 = &local_2280;
        local_21f8 = 0;
        local_21fc = 0;
        local_2200 = 0;
        local_2204 = 0;
        local_2218 = 0;
        local_2220 = 0;
        local_2228 = 0;
        local_2230 = 0;
        local_2260 = local_20c8;
        local_17dc = 0x10;
        local_17ec = 0x10;
        local_188c = local_20bc;
        local_1890 = local_20b8;
        local_1894 = local_20b4;
        local_18a8 = local_20d8;
        local_18ac = local_20d0;
        local_18b8 = local_20c8;
        local_1ea4 = local_20f0;
        local_1ea5 = 1;
        local_1ebc = local_20f0;
        local_1ebd = 1;
        local_21f0 = 0;
        local_2208 = 0;
        local_2280 = 0;
        local_2270 = 0;
        local_2268 = 0;
        local_2258 = 0;
        local_2254 = 0;
        local_2250 = 0;
        local_224c = 0;
        local_2248 = 0;
        local_2240 = 0;
        local_2278 = 0;
        local_2284 = 0;
        local_1aa4 = *(uint *)(in_RDI + 0xe0);
        auVar2 = vinsertps_avx(ZEXT416(local_1aa4),ZEXT416(local_1aa4),0x10);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(local_1aa4),0x20);
        auVar2 = vinsertps_avx(auVar2,ZEXT416(local_1aa4),0x30);
        auVar3 = vinsertps_avx(ZEXT416(local_1aa4),ZEXT416(local_1aa4),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(local_1aa4),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(local_1aa4),0x30);
        auVar72._16_16_ = auVar2;
        auVar72._0_16_ = auVar3;
        local_14c0._0_8_ = auVar3._0_8_;
        local_14c0._8_8_ = auVar3._8_8_;
        local_14c0._16_8_ = auVar2._0_8_;
        local_14c0._24_8_ = auVar2._8_8_;
        local_22c0 = local_14c0._0_8_;
        uStack_22b8 = local_14c0._8_8_;
        uStack_22b0 = local_14c0._16_8_;
        uStack_22a8 = local_14c0._24_8_;
        local_1aa8 = local_20ec;
        local_1444 = local_20ec;
        local_1448 = local_20ec;
        local_144c = local_20ec;
        local_1450 = local_20ec;
        local_1454 = local_20ec;
        local_1458 = local_20ec;
        local_145c = local_20ec;
        local_1460 = local_20ec;
        auVar4 = vinsertps_avx(ZEXT416((uint)local_20ec),ZEXT416((uint)local_20ec),0x10);
        auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)local_20ec),0x20);
        auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)local_20ec),0x30);
        auVar5 = vinsertps_avx(ZEXT416((uint)local_20ec),ZEXT416((uint)local_20ec),0x10);
        auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)local_20ec),0x20);
        auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)local_20ec),0x30);
        auVar73._16_16_ = auVar4;
        auVar73._0_16_ = auVar5;
        local_1480._0_8_ = auVar5._0_8_;
        local_1480._8_8_ = auVar5._8_8_;
        local_1480._16_8_ = auVar4._0_8_;
        local_1480._24_8_ = auVar4._8_8_;
        local_22e0 = local_1480._0_8_;
        uStack_22d8 = local_1480._8_8_;
        uStack_22d0 = local_1480._16_8_;
        uStack_22c8 = local_1480._24_8_;
        local_1aac = *(uint *)(in_RDI + 0xdc) ^ 0x80000000;
        auVar6 = vinsertps_avx(ZEXT416(local_1aac),ZEXT416(local_1aac),0x10);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(local_1aac),0x20);
        auVar6 = vinsertps_avx(auVar6,ZEXT416(local_1aac),0x30);
        auVar7 = vinsertps_avx(ZEXT416(local_1aac),ZEXT416(local_1aac),0x10);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(local_1aac),0x20);
        auVar7 = vinsertps_avx(auVar7,ZEXT416(local_1aac),0x30);
        auVar74._16_16_ = auVar6;
        auVar74._0_16_ = auVar7;
        local_1440._0_8_ = auVar7._0_8_;
        local_1440._8_8_ = auVar7._8_8_;
        local_1440._16_8_ = auVar6._0_8_;
        local_1440._24_8_ = auVar6._8_8_;
        local_2300._16_8_ = local_1440._16_8_;
        local_2300._0_16_ = auVar7;
        local_2300._24_8_ = local_1440._24_8_;
        local_2238 = local_18a0;
        local_21e8 = local_18d8;
        uVar12 = uStack_13c8;
        for (; uStack_13c8 = uVar12, uVar69 = uStack_13c8._4_4_, fVar68 = uStack_13d0._4_4_,
            fVar67 = uStack_13d8._4_4_, fVar66 = local_13e0._4_4_, local_16d8 = local_1d90,
            local_16b8 = local_1da0, local_14a0 = local_1aa4, local_149c = local_1aa4,
            local_1498 = local_1aa4, local_1494 = local_1aa4, local_1490 = local_1aa4,
            local_148c = local_1aa4, local_1488 = local_1aa4, local_1484 = local_1aa4,
            local_1420 = local_1aac, local_141c = local_1aac, local_1418 = local_1aac,
            local_1414 = local_1aac, local_1410 = local_1aac, local_140c = local_1aac,
            local_1408 = local_1aac, local_1404 = local_1aac, local_2210 = local_18f0,
            local_2284 + 7 < local_1f54; local_2284 = local_2284 + 8) {
          local_1d00 = local_21e8;
          uVar12 = *(undefined8 *)*local_21e8;
          uVar13 = *(undefined8 *)(*local_21e8 + 8);
          uVar14 = *(undefined8 *)(*local_21e8 + 0x10);
          uVar15 = *(undefined8 *)(*local_21e8 + 0x18);
          local_1d08 = local_2238;
          uVar16 = *(undefined8 *)local_2238;
          uVar17 = *(undefined8 *)(local_2238 + 2);
          uVar18 = *(undefined8 *)(local_2238 + 4);
          uVar19 = *(undefined8 *)(local_2238 + 6);
          local_1c80._0_4_ = (float)uVar16;
          local_1c80._4_4_ = (float)((ulong)uVar16 >> 0x20);
          uStack_1c78._0_4_ = (float)uVar17;
          uStack_1c78._4_4_ = (float)((ulong)uVar17 >> 0x20);
          uStack_1c70._0_4_ = (float)uVar18;
          uStack_1c70._4_4_ = (float)((ulong)uVar18 >> 0x20);
          uStack_1c68._0_4_ = (float)uVar19;
          uStack_1c68._4_4_ = (float)((ulong)uVar19 >> 0x20);
          local_1ca0._0_4_ = auVar5._0_4_;
          local_1ca0._4_4_ = auVar5._4_4_;
          uStack_1c98._0_4_ = auVar5._8_4_;
          uStack_1c98._4_4_ = auVar5._12_4_;
          uStack_1c90._0_4_ = auVar4._0_4_;
          uStack_1c90._4_4_ = auVar4._4_4_;
          uStack_1c88._0_4_ = auVar4._8_4_;
          local_1b20 = CONCAT44(local_1c80._4_4_ * local_1ca0._4_4_,
                                (float)local_1c80 * (float)local_1ca0);
          uStack_1b18 = CONCAT44(uStack_1c78._4_4_ * uStack_1c98._4_4_,
                                 (float)uStack_1c78 * (float)uStack_1c98);
          uStack_1b10 = CONCAT44(uStack_1c70._4_4_ * uStack_1c90._4_4_,
                                 (float)uStack_1c70 * (float)uStack_1c90);
          uStack_1b08 = CONCAT44(uStack_1c68._4_4_,(float)uStack_1c68 * (float)uStack_1c88);
          local_1b40._0_4_ = auVar3._0_4_;
          local_1b40._4_4_ = auVar3._4_4_;
          uStack_1b38._0_4_ = auVar3._8_4_;
          uStack_1b38._4_4_ = auVar3._12_4_;
          uStack_1b30._0_4_ = auVar2._0_4_;
          uStack_1b30._4_4_ = auVar2._4_4_;
          uStack_1b28._0_4_ = auVar2._8_4_;
          uStack_1b28._4_4_ = auVar2._12_4_;
          local_1a80 = CONCAT44(local_1c80._4_4_ * local_1ca0._4_4_ + local_1b40._4_4_,
                                (float)local_1c80 * (float)local_1ca0 + (float)local_1b40);
          uStack_1a78 = CONCAT44(uStack_1c78._4_4_ * uStack_1c98._4_4_ + uStack_1b38._4_4_,
                                 (float)uStack_1c78 * (float)uStack_1c98 + (float)uStack_1b38);
          uStack_1a70 = CONCAT44(uStack_1c70._4_4_ * uStack_1c90._4_4_ + uStack_1b30._4_4_,
                                 (float)uStack_1c70 * (float)uStack_1c90 + (float)uStack_1b30);
          uStack_1a68 = CONCAT44(uStack_1c68._4_4_ + uStack_1b28._4_4_,
                                 (float)uStack_1c68 * (float)uStack_1c88 + (float)uStack_1b28);
          local_1aa0 = local_1440._0_8_;
          uStack_1a98 = local_1440._8_8_;
          uStack_1a90 = local_1440._16_8_;
          uStack_1a88 = local_1440._24_8_;
          uStack_1138 = uStack_1a78;
          local_1140 = (undefined1  [8])local_1a80;
          uStack_1130 = uStack_1a70;
          uStack_1128 = uStack_1a68;
          local_1180 = 0x3f800000;
          uStack_117c = 0x3f800000;
          uStack_1178 = 0x3f800000;
          uStack_1174 = 0x3f800000;
          uStack_1170 = 0x3f800000;
          uStack_116c = 0x3f800000;
          uStack_1168 = 0x3f800000;
          uStack_1164 = 0x3f800000;
          local_fa0 = 0;
          uStack_f98 = 0;
          uStack_f90 = 0;
          uStack_f88 = 0;
          local_11a0 = vcmpps_avx(_local_1140,ZEXT1632(ZEXT816(0)),2);
          local_f20 = 0x800000;
          uStack_f1c = 0x800000;
          uStack_f18 = 0x800000;
          uStack_f14 = 0x800000;
          uStack_f10 = 0x800000;
          uStack_f0c = 0x800000;
          uStack_f08 = 0x800000;
          uStack_f04 = 0x800000;
          auVar31._16_8_ = uStack_1a70;
          auVar31._0_16_ = _local_1140;
          auVar31._24_8_ = uStack_1a68;
          auVar30._8_4_ = 0x800000;
          auVar30._0_8_ = 0x80000000800000;
          auVar30._12_4_ = 0x800000;
          auVar30._16_4_ = 0x800000;
          auVar30._20_4_ = 0x800000;
          auVar30._24_4_ = 0x800000;
          auVar30._28_4_ = 0x800000;
          auVar8 = vmaxps_avx(auVar31,auVar30);
          local_1140 = auVar8._0_8_;
          local_1e0 = local_1140;
          uStack_1138 = auVar8._8_8_;
          uStack_1d8 = uStack_1138;
          uStack_1130 = auVar8._16_8_;
          uStack_1d0 = uStack_1130;
          uStack_1128 = auVar8._24_8_;
          uStack_1c8 = uStack_1128;
          local_200 = local_1140;
          uStack_1f8 = uStack_1138;
          uStack_1f0 = uStack_1130;
          uStack_1e8 = uStack_1128;
          local_204 = 0x17;
          local_c0 = local_1140;
          uStack_b8 = uStack_1138;
          uStack_b0 = uStack_1130;
          uStack_a8 = uStack_1128;
          local_c4 = 0x17;
          auVar10 = vpsrld_avx2(auVar8,ZEXT416(0x17));
          local_2860 = auVar10._0_8_;
          uStack_2858 = auVar10._8_8_;
          uStack_2850 = auVar10._16_8_;
          uStack_2848 = auVar10._24_8_;
          local_c60 = local_1140;
          uStack_c58 = uStack_1138;
          uStack_c50 = uStack_1130;
          uStack_c48 = uStack_1128;
          local_c80 = 0x807fffff;
          uStack_c7c = 0x807fffff;
          uStack_c78 = 0x807fffff;
          uStack_c74 = 0x807fffff;
          uStack_c70 = 0x807fffff;
          uStack_c6c = 0x807fffff;
          uStack_c68 = 0x807fffff;
          uStack_c64 = 0x807fffff;
          auVar34._8_4_ = 0x807fffff;
          auVar34._0_8_ = 0x807fffff807fffff;
          auVar34._12_4_ = 0x807fffff;
          auVar34._16_4_ = 0x807fffff;
          auVar34._20_4_ = 0x807fffff;
          auVar34._24_4_ = 0x807fffff;
          auVar34._28_4_ = 0x807fffff;
          auVar8 = vpand_avx2(auVar8,auVar34);
          local_1140 = auVar8._0_8_;
          local_160 = local_1140;
          uStack_1138 = auVar8._8_8_;
          uStack_158 = uStack_1138;
          uStack_1130 = auVar8._16_8_;
          uStack_150 = uStack_1130;
          uStack_1128 = auVar8._24_8_;
          uStack_148 = uStack_1128;
          local_180 = 0x3f000000;
          uStack_17c = 0x3f000000;
          uStack_178 = 0x3f000000;
          uStack_174 = 0x3f000000;
          uStack_170 = 0x3f000000;
          uStack_16c = 0x3f000000;
          uStack_168 = 0x3f000000;
          uStack_164 = 0x3f000000;
          auVar60._8_4_ = 0x3f000000;
          auVar60._0_8_ = 0x3f0000003f000000;
          auVar60._12_4_ = 0x3f000000;
          auVar60._16_4_ = 0x3f000000;
          auVar60._20_4_ = 0x3f000000;
          auVar60._24_4_ = 0x3f000000;
          auVar60._28_4_ = 0x3f000000;
          auVar9 = vpor_avx2(auVar8,auVar60);
          local_120 = local_2860;
          uStack_118 = uStack_2858;
          uStack_110 = uStack_2850;
          uStack_108 = uStack_2848;
          local_140 = 0x7f0000007f;
          uStack_138 = 0x7f0000007f;
          uStack_130 = 0x7f0000007f;
          uStack_128 = 0x7f0000007f;
          local_80 = local_2860;
          uStack_78 = uStack_2858;
          uStack_70 = uStack_2850;
          uStack_68 = uStack_2848;
          local_a0 = 0x7f0000007f;
          uStack_98 = 0x7f0000007f;
          uStack_90 = 0x7f0000007f;
          uStack_88 = 0x7f0000007f;
          auVar61._8_8_ = 0x7f0000007f;
          auVar61._0_8_ = 0x7f0000007f;
          auVar61._16_8_ = 0x7f0000007f;
          auVar61._24_8_ = 0x7f0000007f;
          auVar8 = vpsubd_avx2(auVar10,auVar61);
          local_28a0 = auVar8._0_8_;
          local_1160 = local_28a0;
          uStack_2898 = auVar8._8_8_;
          uStack_1158 = uStack_2898;
          uStack_2890 = auVar8._16_8_;
          uStack_1150 = uStack_2890;
          uStack_2888 = auVar8._24_8_;
          uStack_1148 = uStack_2888;
          local_100 = local_28a0;
          uStack_f8 = uStack_2898;
          uStack_f0 = uStack_2890;
          uStack_e8 = uStack_2888;
          auVar8 = vcvtdq2ps_avx(auVar8);
          local_11c0 = auVar8._0_8_;
          uVar20 = local_11c0;
          uStack_11b8 = auVar8._8_8_;
          uVar21 = uStack_11b8;
          uStack_11b0 = auVar8._16_8_;
          uVar22 = uStack_11b0;
          uStack_11a8 = auVar8._24_8_;
          uVar23 = uStack_11a8;
          local_fe0 = 0x3f8000003f800000;
          uStack_fd8 = 0x3f8000003f800000;
          uStack_fd0 = 0x3f8000003f800000;
          uStack_fc8 = 0x3f8000003f800000;
          local_fc0._0_4_ = auVar8._0_4_;
          local_fc0._4_4_ = auVar8._4_4_;
          uStack_fb8._0_4_ = auVar8._8_4_;
          uStack_fb8._4_4_ = auVar8._12_4_;
          uStack_fb0._0_4_ = auVar8._16_4_;
          uStack_fb0._4_4_ = auVar8._20_4_;
          uStack_fa8._0_4_ = auVar8._24_4_;
          uStack_fa8._4_4_ = auVar8._28_4_;
          local_11c0._4_4_ = local_fc0._4_4_ + 1.0;
          local_11c0._0_4_ = (float)local_fc0 + 1.0;
          uStack_11b8._0_4_ = (float)uStack_fb8 + 1.0;
          uStack_11b8._4_4_ = uStack_fb8._4_4_ + 1.0;
          uStack_11b0._0_4_ = (float)uStack_fb0 + 1.0;
          uStack_11b0._4_4_ = uStack_fb0._4_4_ + 1.0;
          auVar62 = _local_11c0;
          uStack_11a8._0_4_ = (float)uStack_fa8 + 1.0;
          uStack_11a8._4_4_ = uStack_fa8._4_4_ + 1.0;
          auVar10 = _local_11c0;
          auVar75._8_4_ = 0x3f3504f3;
          auVar75._0_8_ = 0x3f3504f33f3504f3;
          auVar75._12_4_ = 0x3f3504f3;
          auVar75._16_4_ = 0x3f3504f3;
          auVar75._20_4_ = 0x3f3504f3;
          auVar75._24_4_ = 0x3f3504f3;
          auVar75._28_4_ = 0x3f3504f3;
          local_11e0 = vcmpps_avx(auVar9,auVar75,1);
          local_1140 = auVar9._0_8_;
          local_ca0 = local_1140;
          uStack_1138 = auVar9._8_8_;
          uStack_c98 = uStack_1138;
          uStack_1130 = auVar9._16_8_;
          uStack_c90 = uStack_1130;
          uStack_1128 = auVar9._24_8_;
          uStack_c88 = uStack_1128;
          local_cc0 = local_11e0._0_8_;
          uStack_cb8 = local_11e0._8_8_;
          uStack_cb0 = local_11e0._16_8_;
          uStack_ca8 = local_11e0._24_8_;
          local_1200 = vpand_avx2(auVar9,local_11e0);
          local_ba0 = local_1140;
          uStack_b98 = uStack_1138;
          uStack_b90 = uStack_1130;
          uStack_b88 = uStack_1128;
          local_bc0 = 0x3f8000003f800000;
          uStack_bb8 = 0x3f8000003f800000;
          uStack_bb0 = 0x3f8000003f800000;
          uStack_ba8 = 0x3f8000003f800000;
          auVar37._8_8_ = 0x3f8000003f800000;
          auVar37._0_8_ = 0x3f8000003f800000;
          auVar37._16_8_ = 0x3f8000003f800000;
          auVar37._24_8_ = 0x3f8000003f800000;
          auVar8 = vsubps_avx(auVar9,auVar37);
          local_be0 = local_11c0;
          uStack_bd8 = uStack_11b8;
          uStack_11b0 = auVar62._16_8_;
          uStack_bd0 = uStack_11b0;
          uStack_11a8 = auVar10._24_8_;
          uStack_bc8 = uStack_11a8;
          local_ce0 = 0x3f8000003f800000;
          uStack_cd8 = 0x3f8000003f800000;
          uStack_cd0 = 0x3f8000003f800000;
          uStack_cc8 = 0x3f8000003f800000;
          local_d00 = local_11e0._0_8_;
          uStack_cf8 = local_11e0._8_8_;
          uStack_cf0 = local_11e0._16_8_;
          uStack_ce8 = local_11e0._24_8_;
          auVar33._8_8_ = 0x3f8000003f800000;
          auVar33._0_8_ = 0x3f8000003f800000;
          auVar33._16_8_ = 0x3f8000003f800000;
          auVar33._24_8_ = 0x3f8000003f800000;
          local_c00 = vpand_avx2(auVar33,local_11e0);
          auVar36._16_8_ = uStack_11b0;
          auVar36._0_16_ = _local_11c0;
          auVar36._24_8_ = uStack_11a8;
          _local_11c0 = vsubps_avx(auVar36,local_c00);
          local_1140 = auVar8._0_8_;
          uVar24 = local_1140;
          uStack_1138 = auVar8._8_8_;
          uVar25 = uStack_1138;
          uStack_1130 = auVar8._16_8_;
          uVar26 = uStack_1130;
          uStack_1128 = auVar8._24_8_;
          uVar27 = uStack_1128;
          local_1000._0_4_ = auVar8._0_4_;
          local_1000._4_4_ = auVar8._4_4_;
          uStack_ff8._0_4_ = auVar8._8_4_;
          uStack_ff8._4_4_ = auVar8._12_4_;
          uStack_ff0._0_4_ = auVar8._16_4_;
          uStack_ff0._4_4_ = auVar8._20_4_;
          uStack_fe8._0_4_ = auVar8._24_4_;
          uStack_fe8._4_4_ = auVar8._28_4_;
          local_1020._0_4_ = local_1200._0_4_;
          local_1020._4_4_ = local_1200._4_4_;
          uStack_1018._0_4_ = local_1200._8_4_;
          uStack_1018._4_4_ = local_1200._12_4_;
          uStack_1010._0_4_ = local_1200._16_4_;
          uStack_1010._4_4_ = local_1200._20_4_;
          uStack_1008._0_4_ = local_1200._24_4_;
          uStack_1008._4_4_ = local_1200._28_4_;
          local_1140._0_4_ = (float)local_1000 + (float)local_1020;
          local_1140._4_4_ = local_1000._4_4_ + local_1020._4_4_;
          uStack_ff8._0_4_ = (float)uStack_ff8 + (float)uStack_1018;
          uStack_ff8._4_4_ = uStack_ff8._4_4_ + uStack_1018._4_4_;
          uStack_ff0._0_4_ = (float)uStack_ff0 + (float)uStack_1010;
          uStack_ff0._4_4_ = uStack_ff0._4_4_ + uStack_1010._4_4_;
          uStack_fe8._0_4_ = (float)uStack_fe8 + (float)uStack_1008;
          fStack_1204 = uStack_fe8._4_4_ + uStack_1008._4_4_;
          uStack_1138._0_4_ = (float)uStack_ff8;
          uStack_1138._4_4_ = uStack_ff8._4_4_;
          uStack_1130._0_4_ = (float)uStack_ff0;
          uStack_1130._4_4_ = uStack_ff0._4_4_;
          auVar62 = _local_1140;
          uStack_1128._0_4_ = (float)uStack_fe8;
          uStack_1128._4_4_ = fStack_1204;
          auVar9 = _local_1140;
          local_10a0 = local_1140;
          uStack_1098 = uStack_1138;
          uStack_1130 = auVar62._16_8_;
          uStack_1090 = uStack_1130;
          uStack_1128 = auVar9._24_8_;
          uStack_1088 = uStack_1128;
          local_1220 = (float)local_1140._0_4_ * (float)local_1140._0_4_;
          fStack_121c = (float)local_1140._4_4_ * (float)local_1140._4_4_;
          fStack_1218 = (float)uStack_ff8 * (float)uStack_ff8;
          fStack_1214 = uStack_ff8._4_4_ * uStack_ff8._4_4_;
          fStack_1210 = (float)uStack_ff0 * (float)uStack_ff0;
          fStack_120c = uStack_ff0._4_4_ * uStack_ff0._4_4_;
          fStack_1208 = (float)uStack_fe8 * (float)uStack_fe8;
          uStack_1238._0_4_ = 0x3d9021bb;
          local_1240 = (undefined1  [8])0x3d9021bb3d9021bb;
          uStack_1238._4_4_ = 0x3d9021bb;
          uStack_1230._0_4_ = 0x3d9021bb;
          uStack_1230._4_4_ = 0x3d9021bb;
          auVar62 = _local_1240;
          uStack_1228._0_4_ = 0.070376836;
          uStack_1228._4_4_ = 0x3d9021bb;
          auVar8 = _local_1240;
          local_db0 = local_1240;
          local_db8 = local_1140;
          local_dc0 = ::_ps256_cephes_log_p1;
          local_740 = 0x3d9021bb3d9021bb;
          uStack_738 = uStack_1238;
          uStack_1230 = auVar62._16_8_;
          uStack_730 = uStack_1230;
          uStack_1228 = auVar8._24_8_;
          uStack_728 = uStack_1228;
          local_760 = local_1140;
          uStack_758 = uStack_1138;
          uStack_750 = uStack_1130;
          uStack_748 = uStack_1128;
          local_780[0] = -0.1151461;
          local_780[1] = -0.1151461;
          afStack_778[0] = -0.1151461;
          afStack_778[1] = -0.1151461;
          afStack_770[0] = -0.1151461;
          afStack_770[1] = -0.1151461;
          afStack_768[0] = -0.1151461;
          afStack_768[1] = -0.1151461;
          auVar45._8_4_ = -0.1151461;
          auVar45._12_4_ = -0.1151461;
          auVar45._0_4_ = -0.1151461;
          auVar45._4_4_ = -0.1151461;
          auVar45._16_4_ = -0.1151461;
          auVar45._20_4_ = -0.1151461;
          auVar45._24_4_ = -0.1151461;
          auVar45._28_4_ = -0.1151461;
          auVar11 = vfmadd213ps_fma(auVar9,auVar8,auVar45);
          _local_1240 = ZEXT1632(auVar11);
          auVar8 = _local_1240;
          local_dc8 = local_1240;
          local_dd0 = local_1140;
          local_dd8 = ::_ps256_cephes_log_p2;
          local_1240 = auVar11._0_8_;
          local_6e0 = local_1240;
          uStack_1238 = auVar11._8_8_;
          uStack_6d8 = uStack_1238;
          uStack_6d0 = 0;
          uStack_6c8 = 0;
          local_700 = local_1140;
          uStack_6f8 = uStack_1138;
          uStack_6f0 = uStack_1130;
          uStack_6e8 = uStack_1128;
          local_720[0] = 0.116769984;
          local_720[1] = 0.116769984;
          afStack_718[0] = 0.116769984;
          afStack_718[1] = 0.116769984;
          afStack_710[0] = 0.116769984;
          afStack_710[1] = 0.116769984;
          afStack_708[0] = 0.116769984;
          afStack_708[1] = 0.116769984;
          auVar46._8_4_ = 0.116769984;
          auVar46._12_4_ = 0.116769984;
          auVar46._0_4_ = 0.116769984;
          auVar46._4_4_ = 0.116769984;
          auVar46._16_4_ = 0.116769984;
          auVar46._20_4_ = 0.116769984;
          auVar46._24_4_ = 0.116769984;
          auVar46._28_4_ = 0.116769984;
          auVar11 = vfmadd213ps_fma(auVar9,auVar8,auVar46);
          _local_1240 = ZEXT1632(auVar11);
          auVar8 = _local_1240;
          local_de0 = local_1240;
          local_de8 = local_1140;
          local_df0 = ::_ps256_cephes_log_p3;
          local_1240 = auVar11._0_8_;
          local_680 = local_1240;
          uStack_1238 = auVar11._8_8_;
          uStack_678 = uStack_1238;
          uStack_670 = 0;
          uStack_668 = 0;
          local_6a0 = local_1140;
          uStack_698 = uStack_1138;
          uStack_690 = uStack_1130;
          uStack_688 = uStack_1128;
          local_6c0[0] = -0.12420141;
          local_6c0[1] = -0.12420141;
          afStack_6b8[0] = -0.12420141;
          afStack_6b8[1] = -0.12420141;
          afStack_6b0[0] = -0.12420141;
          afStack_6b0[1] = -0.12420141;
          afStack_6a8[0] = -0.12420141;
          afStack_6a8[1] = -0.12420141;
          auVar47._8_4_ = -0.12420141;
          auVar47._12_4_ = -0.12420141;
          auVar47._0_4_ = -0.12420141;
          auVar47._4_4_ = -0.12420141;
          auVar47._16_4_ = -0.12420141;
          auVar47._20_4_ = -0.12420141;
          auVar47._24_4_ = -0.12420141;
          auVar47._28_4_ = -0.12420141;
          auVar11 = vfmadd213ps_fma(auVar9,auVar8,auVar47);
          _local_1240 = ZEXT1632(auVar11);
          auVar8 = _local_1240;
          local_df8 = local_1240;
          local_e00 = local_1140;
          local_e08 = ::_ps256_cephes_log_p4;
          local_1240 = auVar11._0_8_;
          local_620 = local_1240;
          uStack_1238 = auVar11._8_8_;
          uStack_618 = uStack_1238;
          uStack_610 = 0;
          uStack_608 = 0;
          local_640 = local_1140;
          uStack_638 = uStack_1138;
          uStack_630 = uStack_1130;
          uStack_628 = uStack_1128;
          local_660[0] = 0.14249323;
          local_660[1] = 0.14249323;
          afStack_658[0] = 0.14249323;
          afStack_658[1] = 0.14249323;
          afStack_650[0] = 0.14249323;
          afStack_650[1] = 0.14249323;
          afStack_648[0] = 0.14249323;
          afStack_648[1] = 0.14249323;
          auVar48._8_4_ = 0.14249323;
          auVar48._12_4_ = 0.14249323;
          auVar48._0_4_ = 0.14249323;
          auVar48._4_4_ = 0.14249323;
          auVar48._16_4_ = 0.14249323;
          auVar48._20_4_ = 0.14249323;
          auVar48._24_4_ = 0.14249323;
          auVar48._28_4_ = 0.14249323;
          auVar11 = vfmadd213ps_fma(auVar9,auVar8,auVar48);
          _local_1240 = ZEXT1632(auVar11);
          auVar8 = _local_1240;
          local_e10 = local_1240;
          local_e18 = local_1140;
          local_e20 = ::_ps256_cephes_log_p5;
          local_1240 = auVar11._0_8_;
          local_5c0 = local_1240;
          uStack_1238 = auVar11._8_8_;
          uStack_5b8 = uStack_1238;
          uStack_5b0 = 0;
          uStack_5a8 = 0;
          local_5e0 = local_1140;
          uStack_5d8 = uStack_1138;
          uStack_5d0 = uStack_1130;
          uStack_5c8 = uStack_1128;
          local_600[0] = -0.16668057;
          local_600[1] = -0.16668057;
          afStack_5f8[0] = -0.16668057;
          afStack_5f8[1] = -0.16668057;
          afStack_5f0[0] = -0.16668057;
          afStack_5f0[1] = -0.16668057;
          afStack_5e8[0] = -0.16668057;
          afStack_5e8[1] = -0.16668057;
          auVar49._8_4_ = -0.16668057;
          auVar49._12_4_ = -0.16668057;
          auVar49._0_4_ = -0.16668057;
          auVar49._4_4_ = -0.16668057;
          auVar49._16_4_ = -0.16668057;
          auVar49._20_4_ = -0.16668057;
          auVar49._24_4_ = -0.16668057;
          auVar49._28_4_ = -0.16668057;
          auVar11 = vfmadd213ps_fma(auVar9,auVar8,auVar49);
          _local_1240 = ZEXT1632(auVar11);
          auVar8 = _local_1240;
          local_e28 = local_1240;
          local_e30 = local_1140;
          local_e38 = ::_ps256_cephes_log_p6;
          local_1240 = auVar11._0_8_;
          local_560 = local_1240;
          uStack_1238 = auVar11._8_8_;
          uStack_558 = uStack_1238;
          uStack_550 = 0;
          uStack_548 = 0;
          local_580 = local_1140;
          uStack_578 = uStack_1138;
          uStack_570 = uStack_1130;
          uStack_568 = uStack_1128;
          local_5a0[0] = 0.20000714;
          local_5a0[1] = 0.20000714;
          afStack_598[0] = 0.20000714;
          afStack_598[1] = 0.20000714;
          afStack_590[0] = 0.20000714;
          afStack_590[1] = 0.20000714;
          afStack_588[0] = 0.20000714;
          afStack_588[1] = 0.20000714;
          auVar50._8_4_ = 0.20000714;
          auVar50._12_4_ = 0.20000714;
          auVar50._0_4_ = 0.20000714;
          auVar50._4_4_ = 0.20000714;
          auVar50._16_4_ = 0.20000714;
          auVar50._20_4_ = 0.20000714;
          auVar50._24_4_ = 0.20000714;
          auVar50._28_4_ = 0.20000714;
          auVar11 = vfmadd213ps_fma(auVar9,auVar8,auVar50);
          _local_1240 = ZEXT1632(auVar11);
          auVar8 = _local_1240;
          local_e40 = local_1240;
          local_e48 = local_1140;
          local_e50 = ::_ps256_cephes_log_p7;
          local_1240 = auVar11._0_8_;
          local_500 = local_1240;
          uStack_1238 = auVar11._8_8_;
          uStack_4f8 = uStack_1238;
          uStack_4f0 = 0;
          uStack_4e8 = 0;
          local_520 = local_1140;
          uStack_518 = uStack_1138;
          uStack_510 = uStack_1130;
          uStack_508 = uStack_1128;
          local_540[0] = -0.24999994;
          local_540[1] = -0.24999994;
          afStack_538[0] = -0.24999994;
          afStack_538[1] = -0.24999994;
          afStack_530[0] = -0.24999994;
          afStack_530[1] = -0.24999994;
          afStack_528[0] = -0.24999994;
          afStack_528[1] = -0.24999994;
          auVar51._8_4_ = -0.24999994;
          auVar51._12_4_ = -0.24999994;
          auVar51._0_4_ = -0.24999994;
          auVar51._4_4_ = -0.24999994;
          auVar51._16_4_ = -0.24999994;
          auVar51._20_4_ = -0.24999994;
          auVar51._24_4_ = -0.24999994;
          auVar51._28_4_ = -0.24999994;
          auVar11 = vfmadd213ps_fma(auVar9,auVar8,auVar51);
          _local_1240 = ZEXT1632(auVar11);
          auVar8 = _local_1240;
          local_e58 = local_1240;
          local_e60 = local_1140;
          local_e68 = ::_ps256_cephes_log_p8;
          local_1240 = auVar11._0_8_;
          local_4a0 = local_1240;
          uStack_1238 = auVar11._8_8_;
          uStack_498 = uStack_1238;
          uStack_490 = 0;
          uStack_488 = 0;
          local_4c0 = local_1140;
          uStack_4b8 = uStack_1138;
          uStack_4b0 = uStack_1130;
          uStack_4a8 = uStack_1128;
          local_4e0[0] = 0.3333333;
          local_4e0[1] = 0.3333333;
          afStack_4d8[0] = 0.3333333;
          afStack_4d8[1] = 0.3333333;
          afStack_4d0[0] = 0.3333333;
          afStack_4d0[1] = 0.3333333;
          afStack_4c8[0] = 0.3333333;
          afStack_4c8[1] = 0.3333333;
          auVar52._8_4_ = 0.3333333;
          auVar52._12_4_ = 0.3333333;
          auVar52._0_4_ = 0.3333333;
          auVar52._4_4_ = 0.3333333;
          auVar52._16_4_ = 0.3333333;
          auVar52._20_4_ = 0.3333333;
          auVar52._24_4_ = 0.3333333;
          auVar52._28_4_ = 0.3333333;
          auVar11 = vfmadd213ps_fma(auVar9,auVar8,auVar52);
          local_29a0 = auVar11._0_8_;
          uStack_2998 = auVar11._8_8_;
          uStack_10b0 = 0;
          uStack_10a8 = 0;
          local_10e0 = local_1140;
          uStack_10d8 = uStack_1138;
          uStack_10d0 = uStack_1130;
          uStack_10c8 = uStack_1128;
          local_10c0._0_4_ = auVar11._0_4_;
          local_10c0._4_4_ = auVar11._4_4_;
          uStack_10b8._0_4_ = auVar11._8_4_;
          uStack_10b8._4_4_ = auVar11._12_4_;
          local_1240._4_4_ = local_10c0._4_4_ * (float)local_1140._4_4_;
          local_1240._0_4_ = (float)local_10c0 * (float)local_1140._0_4_;
          uStack_1238._0_4_ = (float)uStack_10b8 * (float)uStack_ff8;
          uStack_1238._4_4_ = uStack_10b8._4_4_ * uStack_ff8._4_4_;
          uStack_1230._0_4_ = (float)uStack_ff0 * 0.0;
          uStack_1230._4_4_ = uStack_ff0._4_4_ * 0.0;
          auVar62 = _local_1240;
          local_1100 = local_1240;
          uStack_10f8 = uStack_1238;
          uStack_1230 = auVar62._16_8_;
          uStack_10f0 = uStack_1230;
          uStack_1228 = (ulong)(uint)((float)uStack_fe8 * 0.0);
          uStack_10e8 = uStack_1228;
          local_1120 = CONCAT44(fStack_121c,local_1220);
          uStack_1118 = CONCAT44(fStack_1214,fStack_1218);
          uStack_1110 = CONCAT44(fStack_120c,fStack_1210);
          uStack_1108 = CONCAT44(fStack_1204,fStack_1208);
          uStack_1228._0_4_ = (float)uStack_fe8 * 0.0 * fStack_1208;
          local_1240._4_4_ = local_10c0._4_4_ * (float)local_1140._4_4_ * fStack_121c;
          local_1240._0_4_ = (float)local_10c0 * (float)local_1140._0_4_ * local_1220;
          uStack_1238._0_4_ = (float)uStack_10b8 * (float)uStack_ff8 * fStack_1218;
          uStack_1238._4_4_ = uStack_10b8._4_4_ * uStack_ff8._4_4_ * fStack_1214;
          uStack_1230._0_4_ = (float)uStack_ff0 * 0.0 * fStack_1210;
          uStack_1230._4_4_ = uStack_ff0._4_4_ * 0.0 * fStack_120c;
          auVar62 = _local_1240;
          uStack_1228._4_4_ = 0;
          auVar8 = _local_1240;
          local_e70 = local_11c0;
          local_e78 = ::_ps256_cephes_log_q1;
          local_e80 = local_1240;
          local_440 = local_11c0;
          uStack_438 = uStack_11b8;
          uStack_430 = uStack_11b0;
          uStack_428 = uStack_11a8;
          local_460[0] = -0.00021219444;
          local_460[1] = -0.00021219444;
          afStack_458[0] = -0.00021219444;
          afStack_458[1] = -0.00021219444;
          afStack_450[0] = -0.00021219444;
          afStack_450[1] = -0.00021219444;
          afStack_448[0] = -0.00021219444;
          afStack_448[1] = -0.00021219444;
          local_480 = local_1240;
          uStack_478 = uStack_1238;
          uStack_1230 = auVar62._16_8_;
          uStack_470 = uStack_1230;
          uStack_1228 = (ulong)(uint)(float)uStack_1228;
          uStack_468 = uStack_1228;
          auVar53._8_4_ = -0.00021219444;
          auVar53._12_4_ = -0.00021219444;
          auVar53._0_4_ = -0.00021219444;
          auVar53._4_4_ = -0.00021219444;
          auVar53._16_4_ = -0.00021219444;
          auVar53._20_4_ = -0.00021219444;
          auVar53._24_4_ = -0.00021219444;
          auVar53._28_4_ = -0.00021219444;
          auVar11 = vfmadd213ps_fma(auVar53,_local_11c0,auVar8);
          _local_1240 = ZEXT1632(auVar11);
          auVar8 = _local_1240;
          local_b18 = &local_1220;
          local_b20 = ::_ps256_0p5;
          local_b28 = local_1240;
          local_2c0 = CONCAT44(fStack_121c,local_1220);
          uStack_2b8 = CONCAT44(fStack_1214,fStack_1218);
          uStack_2b0 = CONCAT44(fStack_120c,fStack_1210);
          uStack_2a8 = CONCAT44(fStack_1204,fStack_1208);
          auVar64._4_4_ = fStack_121c;
          auVar64._0_4_ = local_1220;
          auVar64._8_4_ = fStack_1218;
          auVar64._12_4_ = fStack_1214;
          auVar64._16_4_ = fStack_1210;
          auVar64._20_4_ = fStack_120c;
          auVar64._24_4_ = fStack_1208;
          auVar64._28_4_ = fStack_1204;
          local_2e0[0] = 0.5;
          local_2e0[1] = 0.5;
          afStack_2d8[0] = 0.5;
          afStack_2d8[1] = 0.5;
          afStack_2d0[0] = 0.5;
          afStack_2d0[1] = 0.5;
          afStack_2c8[0] = 0.5;
          afStack_2c8[1] = 0.5;
          local_1240 = auVar11._0_8_;
          local_300 = local_1240;
          uStack_1238 = auVar11._8_8_;
          uStack_2f8 = uStack_1238;
          uStack_2f0 = 0;
          uStack_2e8 = 0;
          auVar76._8_4_ = 0x80000000;
          auVar76._0_8_ = 0x8000000080000000;
          auVar76._12_4_ = 0x80000000;
          auVar76._16_4_ = 0x80000000;
          auVar76._20_4_ = 0x80000000;
          auVar76._24_4_ = 0x80000000;
          auVar76._28_4_ = 0x80000000;
          auVar57._8_4_ = 0.5;
          auVar57._12_4_ = 0.5;
          auVar57._0_4_ = 0.5;
          auVar57._4_4_ = 0.5;
          auVar57._16_4_ = 0.5;
          auVar57._20_4_ = 0.5;
          auVar57._24_4_ = 0.5;
          auVar57._28_4_ = 0.5;
          auVar11 = vfmadd213ps_fma(auVar57,auVar64 ^ auVar76,auVar8);
          local_29e0 = auVar11._0_8_;
          uStack_29d8 = auVar11._8_8_;
          local_1040 = local_1140;
          uStack_1038 = uStack_1138;
          uStack_1030 = uStack_1130;
          uStack_1028 = uStack_1128;
          uStack_1050 = 0;
          uStack_1048 = 0;
          local_1060._0_4_ = auVar11._0_4_;
          local_1060._4_4_ = auVar11._4_4_;
          uStack_1058._0_4_ = auVar11._8_4_;
          uStack_1058._4_4_ = auVar11._12_4_;
          local_1140._4_4_ = (float)local_1140._4_4_ + local_1060._4_4_;
          local_1140._0_4_ = (float)local_1140._0_4_ + (float)local_1060;
          uStack_1138._0_4_ = (float)uStack_ff8 + (float)uStack_1058;
          uStack_1138._4_4_ = uStack_ff8._4_4_ + uStack_1058._4_4_;
          uStack_1130._0_4_ = (float)uStack_ff0 + 0.0;
          uStack_1130._4_4_ = uStack_ff0._4_4_ + 0.0;
          auVar62 = _local_1140;
          uStack_1128._0_4_ = (float)uStack_fe8 + 0.0;
          uStack_1128._4_4_ = fStack_1204 + 0.0;
          auVar8 = _local_1140;
          local_e88 = local_11c0;
          local_e90 = ::_ps256_cephes_log_q2;
          local_e98 = local_1140;
          local_3e0 = local_11c0;
          uStack_3d8 = uStack_11b8;
          uStack_3d0 = uStack_11b0;
          uStack_3c8 = uStack_11a8;
          local_400[0] = 0.6933594;
          local_400[1] = 0.6933594;
          afStack_3f8[0] = 0.6933594;
          afStack_3f8[1] = 0.6933594;
          afStack_3f0[0] = 0.6933594;
          afStack_3f0[1] = 0.6933594;
          afStack_3e8[0] = 0.6933594;
          afStack_3e8[1] = 0.6933594;
          local_420 = local_1140;
          uStack_418 = uStack_1138;
          uStack_1130 = auVar62._16_8_;
          uStack_410 = uStack_1130;
          uStack_1128 = auVar8._24_8_;
          uStack_408 = uStack_1128;
          auVar54._8_4_ = 0.6933594;
          auVar54._12_4_ = 0.6933594;
          auVar54._0_4_ = 0.6933594;
          auVar54._4_4_ = 0.6933594;
          auVar54._16_4_ = 0.6933594;
          auVar54._20_4_ = 0.6933594;
          auVar54._24_4_ = 0.6933594;
          auVar54._28_4_ = 0.6933594;
          auVar11 = vfmadd213ps_fma(auVar54,_local_11c0,auVar8);
          local_2a00 = auVar11._0_8_;
          uStack_29f8 = auVar11._8_8_;
          _local_1140 = ZEXT1632(auVar11);
          local_1a0 = local_2a00;
          uStack_198 = uStack_29f8;
          uStack_190 = 0;
          uStack_188 = 0;
          local_1c0 = local_11a0._0_8_;
          uStack_1b8 = local_11a0._8_8_;
          uStack_1b0 = local_11a0._16_8_;
          uStack_1a8 = local_11a0._24_8_;
          _local_1240 = vpor_avx2(ZEXT1632(auVar11),local_11a0);
          local_1a40._0_4_ = auVar7._0_4_;
          local_1a40._4_4_ = auVar7._4_4_;
          uStack_1a38._0_4_ = auVar7._8_4_;
          uStack_1a38._4_4_ = auVar7._12_4_;
          uStack_1a30._0_4_ = auVar6._0_4_;
          uStack_1a30._4_4_ = auVar6._4_4_;
          uStack_1a28._0_4_ = auVar6._8_4_;
          uStack_1a28._4_4_ = auVar6._12_4_;
          local_1a60._0_4_ = local_1240._0_4_;
          local_1a60._4_4_ = local_1240._4_4_;
          uStack_1a58._0_4_ = local_1240._8_4_;
          uStack_1a58._4_4_ = local_1240._12_4_;
          uStack_1a50._0_4_ = local_1240._16_4_;
          uStack_1a50._4_4_ = local_1240._20_4_;
          uStack_1a48._0_4_ = local_1240._24_4_;
          local_1320._4_4_ = local_1a40._4_4_ * local_1a60._4_4_;
          local_1320._0_4_ = (float)local_1a40 * (float)local_1a60;
          uStack_1318._0_4_ = (float)uStack_1a38 * (float)uStack_1a58;
          uStack_1318._4_4_ = uStack_1a38._4_4_ * uStack_1a58._4_4_;
          uStack_1310._0_4_ = (float)uStack_1a30 * (float)uStack_1a50;
          uStack_1310._4_4_ = uStack_1a30._4_4_ * uStack_1a50._4_4_;
          auVar62 = _local_1320;
          uStack_1308._0_4_ = (float)uStack_1a28 * (float)uStack_1a48;
          uStack_1308._4_4_ = uStack_1a28._4_4_;
          auVar8 = _local_1320;
          local_f80 = 0;
          uStack_f78 = 0;
          uStack_f70 = 0;
          uStack_f68 = 0;
          local_13a0 = 0x3f800000;
          uStack_139c = 0x3f800000;
          uStack_1398 = 0x3f800000;
          uStack_1394 = 0x3f800000;
          uStack_1390 = 0x3f800000;
          uStack_138c = 0x3f800000;
          uStack_1388 = 0x3f800000;
          uStack_1384 = 0x3f800000;
          local_f40 = local_1320;
          uStack_f38 = uStack_1318;
          uStack_1310 = auVar62._16_8_;
          uStack_f30 = uStack_1310;
          uStack_1308 = auVar8._24_8_;
          uStack_f28 = uStack_1308;
          local_f60 = 0x42b0c0a5;
          uStack_f5c = 0x42b0c0a5;
          uStack_f58 = 0x42b0c0a5;
          uStack_f54 = 0x42b0c0a5;
          uStack_f50 = 0x42b0c0a5;
          uStack_f4c = 0x42b0c0a5;
          uStack_f48 = 0x42b0c0a5;
          uStack_f44 = 0x42b0c0a5;
          auVar29._16_8_ = uStack_1310;
          auVar29._0_16_ = _local_1320;
          auVar29._24_8_ = uStack_1308;
          auVar28._8_4_ = 0x42b0c0a5;
          auVar28._0_8_ = 0x42b0c0a542b0c0a5;
          auVar28._12_4_ = 0x42b0c0a5;
          auVar28._16_4_ = 0x42b0c0a5;
          auVar28._20_4_ = 0x42b0c0a5;
          auVar28._24_4_ = 0x42b0c0a5;
          auVar28._28_4_ = 0x42b0c0a5;
          auVar8 = vminps_avx(auVar29,auVar28);
          local_1320 = auVar8._0_8_;
          local_ec0 = local_1320;
          uStack_1318 = auVar8._8_8_;
          uStack_eb8 = uStack_1318;
          uStack_1310 = auVar8._16_8_;
          uStack_eb0 = uStack_1310;
          uStack_1308 = auVar8._24_8_;
          uStack_ea8 = uStack_1308;
          local_ee0 = 0xc2b0c0a5;
          uStack_edc = 0xc2b0c0a5;
          uStack_ed8 = 0xc2b0c0a5;
          uStack_ed4 = 0xc2b0c0a5;
          uStack_ed0 = 0xc2b0c0a5;
          uStack_ecc = 0xc2b0c0a5;
          uStack_ec8 = 0xc2b0c0a5;
          uStack_ec4 = 0xc2b0c0a5;
          auVar32._8_4_ = 0xc2b0c0a5;
          auVar32._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar32._12_4_ = 0xc2b0c0a5;
          auVar32._16_4_ = 0xc2b0c0a5;
          auVar32._20_4_ = 0xc2b0c0a5;
          auVar32._24_4_ = 0xc2b0c0a5;
          auVar32._28_4_ = 0xc2b0c0a5;
          auVar9 = vmaxps_avx(auVar8,auVar32);
          local_d08 = local_1320;
          local_d10 = ::_ps256_cephes_LOG2EF;
          local_d18 = ::_ps256_0p5;
          local_1320 = auVar9._0_8_;
          local_9e0 = local_1320;
          uStack_1318 = auVar9._8_8_;
          uStack_9d8 = uStack_1318;
          uStack_1310 = auVar9._16_8_;
          uStack_9d0 = uStack_1310;
          uStack_1308 = auVar9._24_8_;
          uStack_9c8 = uStack_1308;
          local_a00[0] = 1.442695;
          local_a00[1] = 1.442695;
          afStack_9f8[0] = 1.442695;
          afStack_9f8[1] = 1.442695;
          afStack_9f0[0] = 1.442695;
          afStack_9f0[1] = 1.442695;
          afStack_9e8[0] = 1.442695;
          afStack_9e8[1] = 1.442695;
          local_a20[0] = 0.5;
          local_a20[1] = 0.5;
          afStack_a18[0] = 0.5;
          afStack_a18[1] = 0.5;
          afStack_a10[0] = 0.5;
          afStack_a10[1] = 0.5;
          afStack_a08[0] = 0.5;
          afStack_a08[1] = 0.5;
          auVar39._8_4_ = 1.442695;
          auVar39._12_4_ = 1.442695;
          auVar39._0_4_ = 1.442695;
          auVar39._4_4_ = 1.442695;
          auVar39._16_4_ = 1.442695;
          auVar39._20_4_ = 1.442695;
          auVar39._24_4_ = 1.442695;
          auVar39._28_4_ = 1.442695;
          auVar38._8_4_ = 0.5;
          auVar38._12_4_ = 0.5;
          auVar38._0_4_ = 0.5;
          auVar38._4_4_ = 0.5;
          auVar38._16_4_ = 0.5;
          auVar38._20_4_ = 0.5;
          auVar38._24_4_ = 0.5;
          auVar38._28_4_ = 0.5;
          auVar11 = vfmadd213ps_fma(auVar39,auVar9,auVar38);
          local_1360 = ZEXT1632(auVar11);
          auVar10 = vroundps_avx(local_1360,1);
          auVar8 = vcmpps_avx(local_1360,auVar10,1);
          local_13c0._0_8_ = auVar8._0_8_;
          local_c20 = local_13c0._0_8_;
          local_13c0._8_8_ = auVar8._8_8_;
          uStack_c18 = local_13c0._8_8_;
          local_13c0._16_8_ = auVar8._16_8_;
          uStack_c10 = local_13c0._16_8_;
          local_13c0._24_8_ = auVar8._24_8_;
          uStack_c08 = local_13c0._24_8_;
          local_c40 = 0x3f8000003f800000;
          uStack_c38 = 0x3f8000003f800000;
          uStack_c30 = 0x3f8000003f800000;
          uStack_c28 = 0x3f8000003f800000;
          auVar35._8_8_ = 0x3f8000003f800000;
          auVar35._0_8_ = 0x3f8000003f800000;
          auVar35._16_8_ = 0x3f8000003f800000;
          auVar35._24_8_ = 0x3f8000003f800000;
          local_13c0 = vpand_avx2(auVar8,auVar35);
          local_1340 = auVar10._0_8_;
          local_b60 = local_1340;
          uStack_1338 = auVar10._8_8_;
          uStack_b58 = uStack_1338;
          uStack_1330 = auVar10._16_8_;
          uStack_b50 = uStack_1330;
          uStack_1328 = auVar10._24_8_;
          uStack_b48 = uStack_1328;
          local_b80 = local_13c0._0_8_;
          uStack_b78 = local_13c0._8_8_;
          uStack_b70 = local_13c0._16_8_;
          uStack_b68 = local_13c0._24_8_;
          local_1360 = vsubps_avx(auVar10,local_13c0);
          local_ae8 = local_1360;
          local_af0 = ::_ps256_cephes_exp_C1;
          local_af8 = local_1320;
          local_380 = local_1360._0_8_;
          uStack_378 = local_1360._8_8_;
          uStack_370 = local_1360._16_8_;
          uStack_368 = local_1360._24_8_;
          local_3a0[0] = 0.6933594;
          local_3a0[1] = 0.6933594;
          afStack_398[0] = 0.6933594;
          afStack_398[1] = 0.6933594;
          afStack_390[0] = 0.6933594;
          afStack_390[1] = 0.6933594;
          afStack_388[0] = 0.6933594;
          afStack_388[1] = 0.6933594;
          local_3c0 = local_1320;
          uStack_3b8 = uStack_1318;
          uStack_3b0 = uStack_1310;
          uStack_3a8 = uStack_1308;
          auVar77._8_4_ = 0x80000000;
          auVar77._0_8_ = 0x8000000080000000;
          auVar77._12_4_ = 0x80000000;
          auVar77._16_4_ = 0x80000000;
          auVar77._20_4_ = 0x80000000;
          auVar77._24_4_ = 0x80000000;
          auVar77._28_4_ = 0x80000000;
          auVar55._8_4_ = 0.6933594;
          auVar55._12_4_ = 0.6933594;
          auVar55._0_4_ = 0.6933594;
          auVar55._4_4_ = 0.6933594;
          auVar55._16_4_ = 0.6933594;
          auVar55._20_4_ = 0.6933594;
          auVar55._24_4_ = 0.6933594;
          auVar55._28_4_ = 0.6933594;
          auVar11 = vfmadd213ps_fma(auVar55,local_1360 ^ auVar77,auVar9);
          _local_1320 = ZEXT1632(auVar11);
          auVar8 = _local_1320;
          local_b00 = local_1360;
          local_b08 = ::_ps256_cephes_exp_C2;
          local_b10 = local_1320;
          local_320 = local_1360._0_8_;
          uStack_318 = local_1360._8_8_;
          uStack_310 = local_1360._16_8_;
          uStack_308 = local_1360._24_8_;
          local_340[0] = -0.00021219444;
          local_340[1] = -0.00021219444;
          afStack_338[0] = -0.00021219444;
          afStack_338[1] = -0.00021219444;
          afStack_330[0] = -0.00021219444;
          afStack_330[1] = -0.00021219444;
          afStack_328[0] = -0.00021219444;
          afStack_328[1] = -0.00021219444;
          local_1320 = auVar11._0_8_;
          local_360 = local_1320;
          uStack_1318 = auVar11._8_8_;
          uStack_358 = uStack_1318;
          uStack_350 = 0;
          uStack_348 = 0;
          auVar78._8_4_ = 0x80000000;
          auVar78._0_8_ = 0x8000000080000000;
          auVar78._12_4_ = 0x80000000;
          auVar78._16_4_ = 0x80000000;
          auVar78._20_4_ = 0x80000000;
          auVar78._24_4_ = 0x80000000;
          auVar78._28_4_ = 0x80000000;
          auVar56._8_4_ = -0.00021219444;
          auVar56._12_4_ = -0.00021219444;
          auVar56._0_4_ = -0.00021219444;
          auVar56._4_4_ = -0.00021219444;
          auVar56._16_4_ = -0.00021219444;
          auVar56._20_4_ = -0.00021219444;
          auVar56._24_4_ = -0.00021219444;
          auVar56._28_4_ = -0.00021219444;
          auVar11 = vfmadd213ps_fma(auVar56,local_1360 ^ auVar78,auVar8);
          local_2a80 = auVar11._0_8_;
          uStack_2a78 = auVar11._8_8_;
          _local_1320 = ZEXT1632(auVar11);
          local_12c0 = local_2a80;
          uStack_12b8 = uStack_2a78;
          uStack_12b0 = 0;
          uStack_12a8 = 0;
          local_12a0._0_4_ = auVar11._0_4_;
          local_12a0._4_4_ = auVar11._4_4_;
          uStack_1298._0_4_ = auVar11._8_4_;
          uStack_1298._4_4_ = auVar11._12_4_;
          local_1340._4_4_ = local_12a0._4_4_ * local_12a0._4_4_;
          local_1340._0_4_ = (float)local_12a0 * (float)local_12a0;
          local_7c0 = local_1340;
          uStack_1338._0_4_ = (float)uStack_1298 * (float)uStack_1298;
          uStack_1338._4_4_ = uStack_1298._4_4_ * uStack_1298._4_4_;
          auVar65 = _local_1340;
          _local_1340 = ZEXT1632(_local_1340);
          auVar9 = _local_1340;
          local_d20 = &local_13e0;
          local_d28 = local_1320;
          local_d30 = ::_ps256_cephes_exp_p1;
          local_980 = 0x3950696739506967;
          uStack_978 = 0x3950696739506967;
          uStack_970 = 0x3950696739506967;
          uStack_968 = 0x3950696739506967;
          auVar63._8_4_ = 0x39506967;
          auVar63._0_8_ = 0x3950696739506967;
          auVar63._12_4_ = 0x39506967;
          auVar63._16_4_ = 0x39506967;
          auVar63._20_4_ = 0x39506967;
          auVar63._24_4_ = 0x39506967;
          auVar63._28_4_ = 0x39506967;
          local_9a0 = local_2a80;
          uStack_998 = uStack_2a78;
          uStack_990 = 0;
          uStack_988 = 0;
          local_9c0[0] = 0.0013981999;
          local_9c0[1] = 0.0013981999;
          afStack_9b8[0] = 0.0013981999;
          afStack_9b8[1] = 0.0013981999;
          afStack_9b0[0] = 0.0013981999;
          afStack_9b0[1] = 0.0013981999;
          afStack_9a8[0] = 0.0013981999;
          afStack_9a8[1] = 0.0013981999;
          auVar40._8_4_ = 0.0013981999;
          auVar40._12_4_ = 0.0013981999;
          auVar40._0_4_ = 0.0013981999;
          auVar40._4_4_ = 0.0013981999;
          auVar40._16_4_ = 0.0013981999;
          auVar40._20_4_ = 0.0013981999;
          auVar40._24_4_ = 0.0013981999;
          auVar40._28_4_ = 0.0013981999;
          auVar11 = vfmadd213ps_fma(_local_1320,auVar63,auVar40);
          local_2aa0 = auVar11._0_8_;
          uStack_2a98 = auVar11._8_8_;
          local_d38 = &local_13e0;
          local_d40 = local_1320;
          local_d48 = ::_ps256_cephes_exp_p2;
          local_920 = local_2aa0;
          uStack_918 = uStack_2a98;
          uStack_910 = 0;
          uStack_908 = 0;
          local_940 = local_2a80;
          uStack_938 = uStack_2a78;
          uStack_930 = 0;
          uStack_928 = 0;
          local_960[0] = 0.008333452;
          local_960[1] = 0.008333452;
          afStack_958[0] = 0.008333452;
          afStack_958[1] = 0.008333452;
          afStack_950[0] = 0.008333452;
          afStack_950[1] = 0.008333452;
          afStack_948[0] = 0.008333452;
          afStack_948[1] = 0.008333452;
          auVar41._8_4_ = 0.008333452;
          auVar41._12_4_ = 0.008333452;
          auVar41._0_4_ = 0.008333452;
          auVar41._4_4_ = 0.008333452;
          auVar41._16_4_ = 0.008333452;
          auVar41._20_4_ = 0.008333452;
          auVar41._24_4_ = 0.008333452;
          auVar41._28_4_ = 0.008333452;
          auVar11 = vfmadd213ps_fma(_local_1320,ZEXT1632(auVar11),auVar41);
          local_2ac0 = auVar11._0_8_;
          uStack_2ab8 = auVar11._8_8_;
          local_d50 = &local_13e0;
          local_d58 = local_1320;
          local_d60 = ::_ps256_cephes_exp_p3;
          local_8c0 = local_2ac0;
          uStack_8b8 = uStack_2ab8;
          uStack_8b0 = 0;
          uStack_8a8 = 0;
          local_8e0 = local_2a80;
          uStack_8d8 = uStack_2a78;
          uStack_8d0 = 0;
          uStack_8c8 = 0;
          local_900[0] = 0.041665796;
          local_900[1] = 0.041665796;
          afStack_8f8[0] = 0.041665796;
          afStack_8f8[1] = 0.041665796;
          afStack_8f0[0] = 0.041665796;
          afStack_8f0[1] = 0.041665796;
          afStack_8e8[0] = 0.041665796;
          afStack_8e8[1] = 0.041665796;
          auVar42._8_4_ = 0.041665796;
          auVar42._12_4_ = 0.041665796;
          auVar42._0_4_ = 0.041665796;
          auVar42._4_4_ = 0.041665796;
          auVar42._16_4_ = 0.041665796;
          auVar42._20_4_ = 0.041665796;
          auVar42._24_4_ = 0.041665796;
          auVar42._28_4_ = 0.041665796;
          auVar11 = vfmadd213ps_fma(_local_1320,ZEXT1632(auVar11),auVar42);
          local_2ae0 = auVar11._0_8_;
          uStack_2ad8 = auVar11._8_8_;
          local_d68 = &local_13e0;
          local_d70 = local_1320;
          local_d78 = ::_ps256_cephes_exp_p4;
          local_860 = local_2ae0;
          uStack_858 = uStack_2ad8;
          uStack_850 = 0;
          uStack_848 = 0;
          local_880 = local_2a80;
          uStack_878 = uStack_2a78;
          uStack_870 = 0;
          uStack_868 = 0;
          local_8a0[0] = 0.16666666;
          local_8a0[1] = 0.16666666;
          afStack_898[0] = 0.16666666;
          afStack_898[1] = 0.16666666;
          afStack_890[0] = 0.16666666;
          afStack_890[1] = 0.16666666;
          afStack_888[0] = 0.16666666;
          afStack_888[1] = 0.16666666;
          auVar43._8_4_ = 0.16666666;
          auVar43._12_4_ = 0.16666666;
          auVar43._0_4_ = 0.16666666;
          auVar43._4_4_ = 0.16666666;
          auVar43._16_4_ = 0.16666666;
          auVar43._20_4_ = 0.16666666;
          auVar43._24_4_ = 0.16666666;
          auVar43._28_4_ = 0.16666666;
          auVar11 = vfmadd213ps_fma(_local_1320,ZEXT1632(auVar11),auVar43);
          local_2b00 = auVar11._0_8_;
          uStack_2af8 = auVar11._8_8_;
          local_d80 = &local_13e0;
          local_d88 = local_1320;
          local_d90 = ::_ps256_cephes_exp_p5;
          local_800 = local_2b00;
          uStack_7f8 = uStack_2af8;
          uStack_7f0 = 0;
          uStack_7e8 = 0;
          local_820 = local_2a80;
          uStack_818 = uStack_2a78;
          uStack_810 = 0;
          uStack_808 = 0;
          local_840[0] = 0.5;
          local_840[1] = 0.5;
          afStack_838[0] = 0.5;
          afStack_838[1] = 0.5;
          afStack_830[0] = 0.5;
          afStack_830[1] = 0.5;
          afStack_828[0] = 0.5;
          afStack_828[1] = 0.5;
          auVar44._8_4_ = 0.5;
          auVar44._12_4_ = 0.5;
          auVar44._0_4_ = 0.5;
          auVar44._4_4_ = 0.5;
          auVar44._16_4_ = 0.5;
          auVar44._20_4_ = 0.5;
          auVar44._24_4_ = 0.5;
          auVar44._28_4_ = 0.5;
          auVar11 = vfmadd213ps_fma(_local_1320,ZEXT1632(auVar11),auVar44);
          local_2b20 = auVar11._0_8_;
          uStack_2b18 = auVar11._8_8_;
          local_d98 = &local_13e0;
          local_da0 = local_1340;
          local_da8 = local_1320;
          local_7a0 = local_2b20;
          uStack_798 = uStack_2b18;
          uStack_790 = 0;
          uStack_788 = 0;
          uStack_1338 = auVar65._8_8_;
          uStack_7b8 = uStack_1338;
          uStack_7b0 = 0;
          uStack_7a8 = 0;
          local_7e0 = local_2a80;
          uStack_7d8 = uStack_2a78;
          uStack_7d0 = 0;
          uStack_7c8 = 0;
          auVar11 = vfmadd213ps_fma(auVar9,ZEXT1632(auVar11),_local_1320);
          local_2b40 = auVar11._0_8_;
          uStack_2b38 = auVar11._8_8_;
          uStack_1250 = 0;
          uStack_1248 = 0;
          local_1280 = 0x3f8000003f800000;
          uStack_1278 = 0x3f8000003f800000;
          uStack_1270 = 0x3f8000003f800000;
          uStack_1268 = 0x3f8000003f800000;
          local_1260._0_4_ = auVar11._0_4_;
          local_1260._4_4_ = auVar11._4_4_;
          uStack_1258._0_4_ = auVar11._8_4_;
          uStack_1258._4_4_ = auVar11._12_4_;
          local_12e0 = CONCAT44(local_1260._4_4_ + 1.0,(float)local_1260 + 1.0);
          uStack_12d8 = CONCAT44(uStack_1258._4_4_ + 1.0,(float)uStack_1258 + 1.0);
          local_ae0._0_4_ = local_1360._0_4_;
          local_ae0._4_4_ = local_1360._4_4_;
          uStack_ad8._0_4_ = local_1360._8_4_;
          uStack_ad8._4_4_ = local_1360._12_4_;
          uStack_ad0._0_4_ = local_1360._16_4_;
          uStack_ad0._4_4_ = local_1360._20_4_;
          uStack_ac8._0_4_ = local_1360._24_4_;
          uStack_ac8._4_4_ = local_1360._28_4_;
          local_1380 = CONCAT44((int)local_ae0._4_4_,(int)(float)local_ae0);
          uStack_1378 = CONCAT44((int)uStack_ad8._4_4_,(int)(float)uStack_ad8);
          uStack_1370 = CONCAT44((int)uStack_ad0._4_4_,(int)(float)uStack_ad0);
          uStack_1368 = CONCAT44((int)uStack_ac8._4_4_,(int)(float)uStack_ac8);
          local_aa0 = local_1380;
          uStack_a98 = uStack_1378;
          uStack_a90 = uStack_1370;
          uStack_a88 = uStack_1368;
          local_ac0 = 0x7f0000007f;
          uStack_ab8 = 0x7f0000007f;
          uStack_ab0 = 0x7f0000007f;
          uStack_aa8 = 0x7f0000007f;
          local_280 = local_1380;
          uStack_278 = uStack_1378;
          uStack_270 = uStack_1370;
          uStack_268 = uStack_1368;
          local_2a0 = 0x7f0000007f;
          uStack_298 = 0x7f0000007f;
          uStack_290 = 0x7f0000007f;
          uStack_288 = 0x7f0000007f;
          auVar59._8_8_ = uStack_1378;
          auVar59._0_8_ = local_1380;
          auVar59._16_8_ = uStack_1370;
          auVar59._24_8_ = uStack_1368;
          auVar58._8_8_ = 0x7f0000007f;
          auVar58._0_8_ = 0x7f0000007f;
          auVar58._16_8_ = 0x7f0000007f;
          auVar58._24_8_ = 0x7f0000007f;
          auVar8 = vpaddd_avx2(auVar59,auVar58);
          local_2b60 = auVar8._0_8_;
          uStack_2b58 = auVar8._8_8_;
          uStack_2b50 = auVar8._16_8_;
          uStack_2b48 = auVar8._24_8_;
          local_a60 = local_2b60;
          uStack_a58 = uStack_2b58;
          uStack_a50 = uStack_2b50;
          uStack_a48 = uStack_2b48;
          local_a64 = 0x17;
          local_240 = local_2b60;
          uStack_238 = uStack_2b58;
          uStack_230 = uStack_2b50;
          uStack_228 = uStack_2b48;
          local_244 = 0x17;
          auVar8 = vpslld_avx2(auVar8,ZEXT416(0x17));
          local_2b80 = auVar8._0_8_;
          local_1380 = local_2b80;
          uStack_2b78 = auVar8._8_8_;
          uStack_1378 = uStack_2b78;
          uStack_2b70 = auVar8._16_8_;
          uStack_1370 = uStack_2b70;
          uStack_2b68 = auVar8._24_8_;
          uStack_1368 = uStack_2b68;
          local_a40 = local_2b80;
          uStack_a38 = uStack_2b78;
          uStack_a30 = uStack_2b70;
          uStack_a28 = uStack_2b68;
          local_1400 = local_2b80;
          uStack_13f8 = uStack_2b78;
          uStack_13f0 = uStack_2b70;
          uStack_13e8 = uStack_2b68;
          uStack_12d0 = 0x3f8000003f800000;
          uStack_12c8 = 0x3f8000003f800000;
          local_1300._0_4_ = auVar8._0_4_;
          local_1300._4_4_ = auVar8._4_4_;
          uStack_12f8._0_4_ = auVar8._8_4_;
          uStack_12f8._4_4_ = auVar8._12_4_;
          uStack_12f0._0_4_ = auVar8._16_4_;
          uStack_12f0._4_4_ = auVar8._20_4_;
          uStack_12e8._0_4_ = auVar8._24_4_;
          local_1300._0_4_ = ((float)local_1260 + 1.0) * (float)local_1300;
          local_13e0._4_4_ = (local_1260._4_4_ + 1.0) * local_1300._4_4_;
          uStack_12f8._0_4_ = ((float)uStack_1258 + 1.0) * (float)uStack_12f8;
          uStack_13d8._4_4_ = (uStack_1258._4_4_ + 1.0) * uStack_12f8._4_4_;
          uStack_13d0._4_4_ = uStack_12f0._4_4_ * 1.0;
          local_2340 = CONCAT44(local_13e0._4_4_,(float)local_1300);
          uStack_2338 = CONCAT44(uStack_13d8._4_4_,(float)uStack_12f8);
          uStack_2330 = CONCAT44(uStack_13d0._4_4_,(float)uStack_12f0 * 1.0);
          uStack_2328 = CONCAT44(0x3f800000,(float)uStack_12e8 * 1.0);
          uStack_13c8._4_4_ = 0x3f800000;
          local_1cc0._0_4_ = (float)uVar12;
          local_1cc0._4_4_ = (float)((ulong)uVar12 >> 0x20);
          uStack_1cb8._0_4_ = (float)uVar13;
          uStack_1cb8._4_4_ = (float)((ulong)uVar13 >> 0x20);
          uStack_1cb0._0_4_ = (float)uVar14;
          uStack_1cb0._4_4_ = (float)((ulong)uVar14 >> 0x20);
          uStack_1ca8._0_4_ = (float)uVar15;
          uStack_1ca8._4_4_ = (undefined4)((ulong)uVar15 >> 0x20);
          local_2320 = CONCAT44(local_1cc0._4_4_ * local_13e0._4_4_,
                                (float)local_1cc0 * (float)local_1300);
          uStack_2318 = CONCAT44(uStack_1cb8._4_4_ * uStack_13d8._4_4_,
                                 (float)uStack_1cb8 * (float)uStack_12f8);
          uStack_2310 = CONCAT44(uStack_1cb0._4_4_ * uStack_13d0._4_4_,
                                 (float)uStack_1cb0 * (float)uStack_12f0 * 1.0);
          uStack_2308 = CONCAT44(uStack_1ca8._4_4_,(float)uStack_1ca8 * (float)uStack_12e8 * 1.0);
          local_1be8 = local_21e8;
          auVar10._8_8_ = uStack_2318;
          auVar10._0_8_ = local_2320;
          auVar10._16_8_ = uStack_2310;
          auVar10._24_8_ = uStack_2308;
          *local_21e8 = auVar10;
          local_2238 = local_2238 + 8;
          local_21e8 = local_21e8 + 1;
          local_1ce0 = local_2340;
          uStack_1cd8 = uStack_2338;
          uStack_1cd0 = uStack_2330;
          uStack_1cc8 = uStack_2328;
          local_1cc0 = uVar12;
          uStack_1cb8 = uVar13;
          uStack_1cb0 = uVar14;
          uStack_1ca8 = uVar15;
          local_1ca0 = local_1480._0_8_;
          uStack_1c98 = local_1480._8_8_;
          uStack_1c90 = local_1480._16_8_;
          uStack_1c88 = local_1480._24_8_;
          local_1c80 = uVar16;
          uStack_1c78 = uVar17;
          uStack_1c70 = uVar18;
          uStack_1c68 = uVar19;
          local_1c20 = local_2320;
          uStack_1c18 = uStack_2318;
          uStack_1c10 = uStack_2310;
          uStack_1c08 = uStack_2308;
          local_1b40 = local_14c0._0_8_;
          uStack_1b38 = local_14c0._8_8_;
          uStack_1b30 = local_14c0._16_8_;
          uStack_1b28 = local_14c0._24_8_;
          local_1a60 = local_1240;
          uStack_1a58 = uStack_1238;
          uStack_1a50 = uStack_1230;
          uStack_1a48 = uStack_1228;
          local_1a40 = local_1440._0_8_;
          uStack_1a38 = local_1440._8_8_;
          uStack_1a30 = local_1440._16_8_;
          uStack_1a28 = local_1440._24_8_;
          local_13e0 = local_2340;
          uStack_13d8 = uStack_2338;
          uStack_13d0 = uStack_2330;
          uVar12 = uStack_2328;
          _local_1340 = auVar9;
          local_1300 = local_2b80;
          uStack_12f8 = uStack_2b78;
          uStack_12f0 = uStack_2b70;
          uStack_12e8 = uStack_2b68;
          local_12a0 = local_12c0;
          uStack_1298 = uStack_12b8;
          uStack_1290 = uStack_12b0;
          uStack_1288 = uStack_12a8;
          local_1260 = local_2b40;
          uStack_1258 = uStack_2b38;
          local_10c0 = local_29a0;
          uStack_10b8 = uStack_2998;
          local_1080 = local_10a0;
          uStack_1078 = uStack_1098;
          uStack_1070 = uStack_1090;
          uStack_1068 = uStack_1088;
          local_1060 = local_29e0;
          uStack_1058 = uStack_29d8;
          local_1020 = local_1200._0_8_;
          uStack_1018 = local_1200._8_8_;
          uStack_1010 = local_1200._16_8_;
          uStack_1008 = local_1200._24_8_;
          local_1000 = uVar24;
          uStack_ff8 = uVar25;
          uStack_ff0 = uVar26;
          uStack_fe8 = uVar27;
          local_fc0 = uVar20;
          uStack_fb8 = uVar21;
          uStack_fb0 = uVar22;
          uStack_fa8 = uVar23;
          local_f00 = local_1a80;
          uStack_ef8 = uStack_1a78;
          uStack_ef0 = uStack_1a70;
          uStack_ee8 = uStack_1a68;
          local_ae0 = local_1360._0_8_;
          uStack_ad8 = local_1360._8_8_;
          uStack_ad0 = local_1360._16_8_;
          uStack_ac8 = local_1360._24_8_;
        }
        for (; uStack_13c8._4_4_ = uVar69, uStack_13d0._4_4_ = fVar68, uStack_13d8._4_4_ = fVar67,
            local_13e0._4_4_ = fVar66, local_1440 = auVar74, local_1480 = auVar73,
            local_14c0 = auVar72, uVar69 = uStack_13c8._4_4_, fVar68 = uStack_13d0._4_4_,
            fVar67 = uStack_13d8._4_4_, fVar66 = local_13e0._4_4_, local_13e0._4_4_ = fVar66,
            uStack_13d8._4_4_ = fVar67, uStack_13d0._4_4_ = fVar68, uStack_13c8._4_4_ = uVar69,
            local_2284 < local_1f54; local_2284 = local_2284 + 1) {
          fVar1 = *(float *)*local_21e8;
          uVar12 = local_13e0;
          uVar13 = uStack_13d8;
          uVar14 = uStack_13d0;
          uVar15 = uStack_13c8;
          fVar71 = powf(*(float *)(in_RDI + 0xe0) + local_20ec * *local_2238,
                        -*(float *)(in_RDI + 0xdc));
          uVar69 = uStack_13c8._4_4_;
          fVar68 = uStack_13d0._4_4_;
          fVar67 = uStack_13d8._4_4_;
          fVar66 = local_13e0._4_4_;
          *(float *)*local_21e8 = fVar1 * fVar71;
          local_2238 = local_2238 + 1;
          local_21e8 = (undefined1 (*) [32])(*local_21e8 + 4);
          auVar72 = local_14c0;
          auVar73 = local_1480;
          auVar74 = local_1440;
        }
        uVar12 = local_13e0;
        uVar13 = uStack_13d8;
        uVar14 = uStack_13d0;
        uVar15 = uStack_13c8;
      }
      local_1fb0 = 0;
      uVar12 = local_13e0;
      uVar13 = uStack_13d8;
      uVar14 = uStack_13d0;
      uVar15 = uStack_13c8;
      local_13e0._4_4_ = fVar66;
      uStack_13d8._4_4_ = fVar67;
      uStack_13d0._4_4_ = fVar68;
      uStack_13c8._4_4_ = uVar69;
    }
    else {
      local_1f1c = -100;
      local_1fb0 = 1;
    }
    uStack_13c8 = uVar15;
    uStack_13d0 = uVar14;
    uStack_13d8 = uVar13;
    local_13e0 = uVar12;
    uVar69 = uStack_13c8._4_4_;
    fVar68 = uStack_13d0._4_4_;
    fVar67 = uStack_13d8._4_4_;
    fVar66 = local_13e0._4_4_;
    local_1d80 = &local_20e8;
    local_16f8 = local_1d80;
    uVar12 = uStack_13c8;
    if (local_20e0 != (int *)0x0) {
      local_16fc = 0xffffffff;
      LOCK();
      local_1700 = *local_20e0;
      *local_20e0 = *local_20e0 + -1;
      UNLOCK();
      if (local_1700 == 1) {
        local_13e0._4_4_ = fVar66;
        uStack_13d8._4_4_ = fVar67;
        uStack_13d0._4_4_ = fVar68;
        uStack_13c8._4_4_ = uVar69;
        if (local_20c8 == (long *)0x0) {
          local_1510 = local_20e8;
          if (local_20e8 != (undefined4 *)0x0) {
            uVar12 = local_13e0;
            uVar13 = uStack_13d8;
            uVar14 = uStack_13d0;
            uVar15 = uStack_13c8;
            free(local_20e8);
            uVar12 = uStack_13c8;
            fVar68 = uStack_13d0._4_4_;
            fVar67 = uStack_13d8._4_4_;
            fVar66 = local_13e0._4_4_;
            uVar69 = uStack_13c8._4_4_;
          }
        }
        else {
          uVar12 = local_13e0;
          uVar13 = uStack_13d8;
          uVar14 = uStack_13d0;
          uVar15 = uStack_13c8;
          (**(code **)(*local_20c8 + 0x18))(local_20c8,local_20e8);
          uVar69 = uStack_13c8._4_4_;
          fVar68 = uStack_13d0._4_4_;
          fVar67 = uStack_13d8._4_4_;
          fVar66 = local_13e0._4_4_;
          uVar12 = uStack_13c8;
        }
      }
    }
    uStack_13c8._4_4_ = uVar69;
    uStack_13d0._4_4_ = fVar68;
    uStack_13d8._4_4_ = fVar67;
    local_13e0._4_4_ = fVar66;
    uStack_13c8 = uVar12;
    uVar69 = uStack_13c8._4_4_;
    fVar68 = uStack_13d0._4_4_;
    fVar67 = uStack_13d8._4_4_;
    fVar66 = local_13e0._4_4_;
    local_20e8 = (undefined4 *)0x0;
    local_20d8 = 0;
    local_20d0 = 0;
    local_20c0 = 0;
    local_20bc = 0;
    local_20b8 = 0;
    local_20b4 = 0;
    local_20b0 = 0;
    local_20a8 = 0;
    local_20e0 = (int *)0x0;
    uVar12 = local_13e0;
    uVar13 = uStack_13d8;
    uVar14 = uStack_13d0;
    uVar15 = uStack_13c8;
    local_13e0._4_4_ = fVar66;
    uStack_13d8._4_4_ = fVar67;
    uStack_13d0._4_4_ = fVar68;
    uStack_13c8._4_4_ = uVar69;
joined_r0x00f48499:
    if (local_1fb0 != 0) goto LAB_00f485d4;
  }
  else if (*(int *)(in_RDI + 0xd0) == 1) {
    local_2344 = local_1f3c;
    local_2348 = local_1f40;
    local_1a08 = &local_2390;
    local_1a10 = &local_1fa0;
    local_2390 = local_1fa0;
    local_2388 = local_1f98;
    local_2380 = local_1f90;
    local_2378 = local_1f88;
    local_2370 = local_1f80;
    local_2368 = local_1f78;
    local_2364 = local_1f74;
    local_2360 = local_1f70;
    local_235c = local_1f6c;
    local_2358 = local_1f68;
    local_2350 = local_1f60;
    if (local_1f98 != (int *)0x0) {
      local_5c = 1;
      LOCK();
      local_60 = *local_1f98;
      *local_1f98 = *local_1f98 + 1;
      UNLOCK();
    }
    local_2394 = *(int *)(in_RDI + 0xd4) / 2;
    local_58 = local_1a08;
    if (local_2394 < 1) {
LAB_00f4773a:
      uStack_13c8 = uVar15;
      uStack_13d0 = uVar14;
      uStack_13d8 = uVar13;
      local_13e0 = uVar12;
      uVar69 = uStack_13c8._4_4_;
      fVar68 = uStack_13d0._4_4_;
      fVar67 = uStack_13d8._4_4_;
      fVar66 = local_13e0._4_4_;
      local_2404 = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd4);
      local_2408 = *(float *)(in_RDI + 0xd8) / (float)local_2404;
      uVar12 = local_13e0;
      local_13e0._4_4_ = fVar66;
      uVar13 = uStack_13d8;
      uStack_13d8._4_4_ = fVar67;
      uVar14 = uStack_13d0;
      uStack_13d0._4_4_ = fVar68;
      uVar15 = uStack_13c8;
      uStack_13c8._4_4_ = uVar69;
      std::allocator<int>::allocator((allocator<int> *)0xf47798);
      uVar15 = uStack_13c8;
      uVar14 = uStack_13d0;
      uVar13 = uStack_13d8;
      uVar12 = local_13e0;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffd36c,in_stack_ffffffffffffd368),
                 in_stack_ffffffffffffd360,in_stack_ffffffffffffd358);
      uStack_13c8 = uVar15;
      uStack_13d0 = uVar14;
      uStack_13d8 = uVar13;
      local_13e0 = uVar12;
      uVar15 = uStack_13c8;
      uVar14 = uStack_13d0;
      uVar13 = uStack_13d8;
      uVar12 = local_13e0;
      std::allocator<int>::~allocator((allocator<int> *)0xf477c4);
      uStack_13c8 = uVar15;
      uStack_13d0 = uVar14;
      uStack_13d8 = uVar13;
      local_13e0 = uVar12;
      uVar15 = uStack_13c8;
      uVar14 = uStack_13d0;
      uVar13 = uStack_13d8;
      uVar12 = local_13e0;
      local_2430 = std::vector<int,_std::allocator<int>_>::operator[](&local_2420,0);
      uStack_13c8 = uVar15;
      uStack_13d0 = uVar14;
      uStack_13d8 = uVar13;
      local_13e0 = uVar12;
      uVar15 = uStack_13c8;
      uVar14 = uStack_13d0;
      uVar13 = uStack_13d8;
      uVar12 = local_13e0;
      local_2434 = 0;
      local_2438 = 0;
      local_243c = local_1f3c - *(int *)(in_RDI + 0xd4);
      for (local_2440 = 0; local_2440 < *(int *)(in_RDI + 0xd4); local_2440 = local_2440 + 1) {
        for (local_2444 = 0; local_2444 < *(int *)(in_RDI + 0xd4); local_2444 = local_2444 + 1) {
          local_2430[local_2434] = local_2438;
          local_2434 = local_2434 + 1;
          local_2438 = local_2438 + 1;
        }
        local_2438 = local_243c + local_2438;
      }
      for (local_2448 = 0; uStack_13c8 = uVar15, uStack_13d0 = uVar14, uStack_13d8 = uVar13,
          local_13e0 = uVar12, uVar69 = uStack_13c8._4_4_, fVar68 = uStack_13d0._4_4_,
          fVar67 = uStack_13d8._4_4_, fVar66 = local_13e0._4_4_, local_2448 < local_1f44;
          local_2448 = local_2448 + 1) {
        local_1ec8 = &local_2498;
        local_1854 = *(int *)((long)local_1f30 + 0x2c);
        local_1858 = (int)local_1f30[6];
        local_185c = *(undefined4 *)((long)local_1f30 + 0x34);
        local_2450 = *local_1f30 + local_1f30[8] * (long)local_2448 * local_1f30[2];
        local_1870 = local_1f30[2];
        local_1874 = (undefined4)local_1f30[3];
        local_1880 = local_1f30[4];
        local_1850 = &local_2498;
        local_17f8 = (long)local_1854 * (long)local_1858 * local_1870;
        local_1d30 = &local_2498;
        local_1d70 = &local_2498;
        local_17fc = 0x10;
        local_1ed4 = local_2448;
        local_1ed5 = 1;
        local_2498 = 0;
        local_2488 = 0;
        local_2480 = 0;
        local_246c = 0;
        local_2468 = 0;
        local_2464 = 0;
        local_2460 = 0;
        local_2490 = 0;
        local_1ee0 = &local_24e0;
        local_1ee8 = &local_2390;
        local_1830 = (void *)((long)local_2390 + local_2350 * local_2448 * local_2380);
        local_1818 = &local_24e0;
        local_24d8 = (int *)0x0;
        local_24d0 = local_2380;
        local_24c8 = local_2378;
        local_24c0 = local_2370;
        local_24b4 = local_2364;
        local_24b0 = local_2360;
        local_24ac = 1;
        local_24a8 = local_235c;
        local_1808 = (long)local_2364 * (long)local_2360 * local_2380;
        local_24a0 = (local_1808 + 0xfU & 0xfffffffffffffff0) / local_2380;
        local_24b8 = local_2368 + -1;
        if (local_2368 == 4) {
          local_24a0 = (long)local_2364 * (long)local_2360;
        }
        local_180c = 0x10;
        local_1824 = local_235c;
        local_1838 = local_2380;
        local_183c = local_2378;
        local_1848 = local_2370;
        local_1eec = local_2448;
        local_1eed = 1;
        local_2458 = 0;
        local_2470 = 0;
        local_1868 = local_2450;
        local_1718 = local_1d70;
        local_24e0 = local_1830;
        local_2478 = local_1880;
        fVar66 = local_13e0._4_4_;
        fVar67 = uStack_13d8._4_4_;
        fVar68 = uStack_13d0._4_4_;
        uVar69 = uStack_13c8._4_4_;
        for (local_24e4 = 0; uStack_13c8._4_4_ = uVar69, uStack_13d0._4_4_ = fVar68,
            uStack_13d8._4_4_ = fVar67, local_13e0._4_4_ = fVar66, uVar69 = uStack_13c8._4_4_,
            fVar68 = uStack_13d0._4_4_, fVar67 = uStack_13d8._4_4_, fVar66 = local_13e0._4_4_,
            local_24e4 < local_2348; local_24e4 = local_24e4 + 1) {
          for (local_24e8 = 0; uStack_13c8._4_4_ = uVar69, uStack_13d0._4_4_ = fVar68,
              uStack_13d8._4_4_ = fVar67, local_13e0._4_4_ = fVar66, uVar69 = uStack_13c8._4_4_,
              fVar68 = uStack_13d0._4_4_, fVar67 = uStack_13d8._4_4_, fVar66 = local_13e0._4_4_,
              local_24e8 < local_2344; local_24e8 = local_24e8 + 1) {
            local_19f8 = &local_24e0;
            local_19fc = local_24e4;
            local_24f4 = 0.0;
            for (local_24f8 = 0; local_24f8 < local_2404; local_24f8 = local_24f8 + 1) {
              local_24f4 = *(float *)((long)local_24e0 +
                                     (long)local_2430[local_24f8] * 4 +
                                     (long)local_24e8 * 4 +
                                     (long)local_24b4 * (long)local_24e4 * local_24d0) + local_24f4;
            }
            fVar1 = *(float *)(local_2450 + (long)local_24e8 * 4);
            uVar12 = local_13e0;
            local_13e0._4_4_ = fVar66;
            uVar13 = uStack_13d8;
            uStack_13d8._4_4_ = fVar67;
            uVar14 = uStack_13d0;
            uStack_13d0._4_4_ = fVar68;
            uVar15 = uStack_13c8;
            uStack_13c8._4_4_ = uVar69;
            fVar71 = powf(*(float *)(in_RDI + 0xe0) + local_2408 * local_24f4,
                          -*(float *)(in_RDI + 0xdc));
            uVar69 = uStack_13c8._4_4_;
            fVar68 = uStack_13d0._4_4_;
            fVar67 = uStack_13d8._4_4_;
            fVar66 = local_13e0._4_4_;
            *(float *)(local_2450 + (long)local_24e8 * 4) = fVar1 * fVar71;
          }
          local_2450 = local_2450 + (long)local_2344 * 4;
        }
        ppvVar79 = &local_24e0;
        local_1d60 = ppvVar79;
        local_1738 = ppvVar79;
        if (local_24d8 != (int *)0x0) {
          local_173c = 0xffffffff;
          LOCK();
          local_1740 = *local_24d8;
          *local_24d8 = *local_24d8 + -1;
          UNLOCK();
          if (local_1740 == 1) {
            local_13e0._4_4_ = fVar66;
            uStack_13d8._4_4_ = fVar67;
            uStack_13d0._4_4_ = fVar68;
            uStack_13c8._4_4_ = uVar69;
            if (local_24c0 == (long *)0x0) {
              local_14f0 = local_24e0;
              if (local_24e0 != (void *)0x0) {
                uVar12 = local_13e0;
                uVar13 = uStack_13d8;
                uVar14 = uStack_13d0;
                uVar15 = uStack_13c8;
                free(local_24e0);
                uVar69 = uStack_13c8._4_4_;
                fVar68 = uStack_13d0._4_4_;
                fVar67 = uStack_13d8._4_4_;
                fVar66 = local_13e0._4_4_;
              }
            }
            else {
              uVar12 = local_13e0;
              uVar13 = uStack_13d8;
              uVar14 = uStack_13d0;
              uVar15 = uStack_13c8;
              (**(code **)(*local_24c0 + 0x18))(local_24c0,local_24e0);
              uVar69 = uStack_13c8._4_4_;
              fVar68 = uStack_13d0._4_4_;
              fVar67 = uStack_13d8._4_4_;
              fVar66 = local_13e0._4_4_;
            }
          }
        }
        uStack_13c8._4_4_ = uVar69;
        uStack_13d0._4_4_ = fVar68;
        uStack_13d8._4_4_ = fVar67;
        local_13e0._4_4_ = fVar66;
        uVar69 = uStack_13c8._4_4_;
        fVar68 = uStack_13d0._4_4_;
        fVar67 = uStack_13d8._4_4_;
        fVar66 = local_13e0._4_4_;
        *ppvVar79 = (void *)0x0;
        ppvVar79[2] = (void *)0x0;
        *(undefined4 *)(ppvVar79 + 3) = 0;
        *(undefined4 *)(ppvVar79 + 5) = 0;
        *(undefined4 *)((long)ppvVar79 + 0x2c) = 0;
        *(undefined4 *)(ppvVar79 + 6) = 0;
        *(undefined4 *)((long)ppvVar79 + 0x34) = 0;
        *(undefined4 *)(ppvVar79 + 7) = 0;
        ppvVar79[8] = (void *)0x0;
        ppvVar79[1] = (void *)0x0;
        uVar12 = local_13e0;
        uVar13 = uStack_13d8;
        uVar14 = uStack_13d0;
        uVar15 = uStack_13c8;
        local_13e0._4_4_ = fVar66;
        uStack_13d8._4_4_ = fVar67;
        uStack_13d0._4_4_ = fVar68;
        uStack_13c8._4_4_ = uVar69;
      }
      uVar12 = local_13e0;
      local_13e0._4_4_ = fVar66;
      uVar13 = uStack_13d8;
      uStack_13d8._4_4_ = fVar67;
      uVar14 = uStack_13d0;
      uStack_13d0._4_4_ = fVar68;
      uVar15 = uStack_13c8;
      uStack_13c8._4_4_ = uVar69;
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffd358);
      uVar69 = uStack_13c8._4_4_;
      fVar68 = uStack_13d0._4_4_;
      fVar67 = uStack_13d8._4_4_;
      fVar66 = local_13e0._4_4_;
      local_1fb0 = 0;
    }
    else {
      auVar70 = vmovdqu64_avx512f(*local_1f38);
      auVar70 = vmovdqa64_avx512f(auVar70);
      local_2400._16_48_ = auVar70._16_48_;
      local_2400._0_8_ = auVar70._0_8_;
      local_2400._8_8_ = *(undefined8 *)(*local_1f38 + 0x10);
      copy_make_border(in_stack_ffffffffffffd398,in_stack_ffffffffffffd390,in_stack_ffffffffffffd38c
                       ,in_stack_ffffffffffffd388,(int)((ulong)in_stack_ffffffffffffd380 >> 0x20),
                       (int)in_stack_ffffffffffffd380,in_stack_ffffffffffffd3a8,
                       in_stack_ffffffffffffd37c,in_stack_ffffffffffffd3b0);
      uStack_13c8 = uVar15;
      uStack_13d0 = uVar14;
      uStack_13d8 = uVar13;
      local_13e0 = uVar12;
      uVar69 = uStack_13c8._4_4_;
      fVar68 = uStack_13d0._4_4_;
      fVar67 = uStack_13d8._4_4_;
      fVar66 = local_13e0._4_4_;
      local_1f08 = &local_2390;
      if (local_2390 != (void *)0x0) {
        local_19d8 = local_1f08;
      }
      if (local_2390 != (void *)0x0 && local_2350 * local_2358 != 0) {
        local_1f3c = local_2364;
        local_1f40 = local_2360;
        uVar12 = local_13e0;
        uVar13 = uStack_13d8;
        uVar14 = uStack_13d0;
        uVar15 = uStack_13c8;
        local_13e0._4_4_ = fVar66;
        uStack_13d8._4_4_ = fVar67;
        uStack_13d0._4_4_ = fVar68;
        uStack_13c8._4_4_ = uVar69;
        goto LAB_00f4773a;
      }
      local_1f1c = -100;
      local_1fb0 = 1;
    }
    uStack_13c8._4_4_ = uVar69;
    uStack_13d0._4_4_ = fVar68;
    uStack_13d8._4_4_ = fVar67;
    local_13e0._4_4_ = fVar66;
    uVar69 = uStack_13c8._4_4_;
    fVar68 = uStack_13d0._4_4_;
    fVar67 = uStack_13d8._4_4_;
    fVar66 = local_13e0._4_4_;
    ppvVar79 = &local_2390;
    local_1d50 = ppvVar79;
    local_1758 = ppvVar79;
    if (local_2388 != (int *)0x0) {
      local_175c = 0xffffffff;
      LOCK();
      local_1760 = *local_2388;
      *local_2388 = *local_2388 + -1;
      UNLOCK();
      if (local_1760 == 1) {
        local_13e0._4_4_ = fVar66;
        uStack_13d8._4_4_ = fVar67;
        uStack_13d0._4_4_ = fVar68;
        uStack_13c8._4_4_ = uVar69;
        if (local_2370 == (long *)0x0) {
          local_14e0 = local_2390;
          if (local_2390 != (void *)0x0) {
            uVar12 = local_13e0;
            uVar13 = uStack_13d8;
            uVar14 = uStack_13d0;
            uVar15 = uStack_13c8;
            free(local_2390);
            uVar69 = uStack_13c8._4_4_;
            fVar68 = uStack_13d0._4_4_;
            fVar67 = uStack_13d8._4_4_;
            fVar66 = local_13e0._4_4_;
          }
        }
        else {
          uVar12 = local_13e0;
          uVar13 = uStack_13d8;
          uVar14 = uStack_13d0;
          uVar15 = uStack_13c8;
          (**(code **)(*local_2370 + 0x18))(local_2370,local_2390);
          uVar69 = uStack_13c8._4_4_;
          fVar68 = uStack_13d0._4_4_;
          fVar67 = uStack_13d8._4_4_;
          fVar66 = local_13e0._4_4_;
        }
      }
    }
    uStack_13c8._4_4_ = uVar69;
    uStack_13d0._4_4_ = fVar68;
    uStack_13d8._4_4_ = fVar67;
    local_13e0._4_4_ = fVar66;
    uVar69 = uStack_13c8._4_4_;
    fVar68 = uStack_13d0._4_4_;
    fVar67 = uStack_13d8._4_4_;
    fVar66 = local_13e0._4_4_;
    *ppvVar79 = (void *)0x0;
    uStack_13c8._4_4_ = uVar69;
    uStack_13d0._4_4_ = fVar68;
    uStack_13d8._4_4_ = fVar67;
    local_13e0._4_4_ = fVar66;
    uVar15 = uStack_13c8;
    uVar14 = uStack_13d0;
    uVar13 = uStack_13d8;
    uVar12 = local_13e0;
    ppvVar79[2] = (void *)0x0;
    uStack_13c8 = uVar15;
    uStack_13d0 = uVar14;
    uStack_13d8 = uVar13;
    local_13e0 = uVar12;
    uVar15 = uStack_13c8;
    uVar14 = uStack_13d0;
    uVar13 = uStack_13d8;
    uVar12 = local_13e0;
    *(undefined4 *)(ppvVar79 + 3) = 0;
    uStack_13c8 = uVar15;
    uStack_13d0 = uVar14;
    uStack_13d8 = uVar13;
    local_13e0 = uVar12;
    uVar15 = uStack_13c8;
    uVar14 = uStack_13d0;
    uVar13 = uStack_13d8;
    uVar12 = local_13e0;
    *(undefined4 *)(ppvVar79 + 5) = 0;
    uStack_13c8 = uVar15;
    uStack_13d0 = uVar14;
    uStack_13d8 = uVar13;
    local_13e0 = uVar12;
    uVar15 = uStack_13c8;
    uVar14 = uStack_13d0;
    uVar13 = uStack_13d8;
    uVar12 = local_13e0;
    *(undefined4 *)((long)ppvVar79 + 0x2c) = 0;
    uStack_13c8 = uVar15;
    uStack_13d0 = uVar14;
    uStack_13d8 = uVar13;
    local_13e0 = uVar12;
    uVar15 = uStack_13c8;
    uVar14 = uStack_13d0;
    uVar13 = uStack_13d8;
    uVar12 = local_13e0;
    *(undefined4 *)(ppvVar79 + 6) = 0;
    uStack_13c8 = uVar15;
    uStack_13d0 = uVar14;
    uStack_13d8 = uVar13;
    local_13e0 = uVar12;
    uVar15 = uStack_13c8;
    uVar14 = uStack_13d0;
    uVar13 = uStack_13d8;
    uVar12 = local_13e0;
    *(undefined4 *)((long)ppvVar79 + 0x34) = 0;
    uStack_13c8 = uVar15;
    uStack_13d0 = uVar14;
    uStack_13d8 = uVar13;
    local_13e0 = uVar12;
    uVar15 = uStack_13c8;
    uVar14 = uStack_13d0;
    uVar13 = uStack_13d8;
    uVar12 = local_13e0;
    *(undefined4 *)(ppvVar79 + 7) = 0;
    uStack_13c8 = uVar15;
    uStack_13d0 = uVar14;
    uStack_13d8 = uVar13;
    local_13e0 = uVar12;
    uVar15 = uStack_13c8;
    uVar14 = uStack_13d0;
    uVar13 = uStack_13d8;
    uVar12 = local_13e0;
    ppvVar79[8] = (void *)0x0;
    uStack_13c8 = uVar15;
    uStack_13d0 = uVar14;
    uStack_13d8 = uVar13;
    local_13e0 = uVar12;
    uVar15 = uStack_13c8;
    uVar14 = uStack_13d0;
    uVar13 = uStack_13d8;
    uVar12 = local_13e0;
    ppvVar79[1] = (void *)0x0;
    uStack_13c8 = uVar15;
    uStack_13d0 = uVar14;
    uStack_13d8 = uVar13;
    local_13e0 = uVar12;
    uVar15 = uStack_13c8;
    uVar14 = uStack_13d0;
    uVar13 = uStack_13d8;
    uVar12 = local_13e0;
    goto joined_r0x00f48499;
  }
  uStack_13c8 = uVar15;
  uStack_13d0 = uVar14;
  uStack_13d8 = uVar13;
  local_13e0 = uVar12;
  uVar69 = uStack_13c8._4_4_;
  fVar68 = uStack_13d0._4_4_;
  fVar67 = uStack_13d8._4_4_;
  fVar66 = local_13e0._4_4_;
  local_1f1c = 0;
  local_1fb0 = 1;
  uVar12 = local_13e0;
  uVar13 = uStack_13d8;
  uVar14 = uStack_13d0;
  uVar15 = uStack_13c8;
  local_13e0._4_4_ = fVar66;
  uStack_13d8._4_4_ = fVar67;
  uStack_13d0._4_4_ = fVar68;
  uStack_13c8._4_4_ = uVar69;
LAB_00f485d4:
  uStack_13c8 = uVar15;
  uStack_13d0 = uVar14;
  uStack_13d8 = uVar13;
  local_13e0 = uVar12;
  uVar69 = uStack_13c8._4_4_;
  fVar68 = uStack_13d0._4_4_;
  fVar67 = uStack_13d8._4_4_;
  fVar66 = local_13e0._4_4_;
  ppvVar79 = &local_1fa0;
  if (local_1f98 != (int *)0x0) {
    local_177c = 0xffffffff;
    LOCK();
    local_1780 = *local_1f98;
    *local_1f98 = *local_1f98 + -1;
    UNLOCK();
    if (local_1780 == 1) {
      local_1d40 = ppvVar79;
      local_1778 = ppvVar79;
      local_13e0._4_4_ = fVar66;
      uStack_13d8._4_4_ = fVar67;
      uStack_13d0._4_4_ = fVar68;
      uStack_13c8._4_4_ = uVar69;
      if (local_1f80 == (long *)0x0) {
        local_14d0 = local_1fa0;
        if (local_1fa0 != (void *)0x0) {
          uVar12 = local_13e0;
          uVar13 = uStack_13d8;
          uVar14 = uStack_13d0;
          uVar15 = uStack_13c8;
          free(local_1fa0);
        }
      }
      else {
        uVar12 = local_13e0;
        uVar13 = uStack_13d8;
        uVar14 = uStack_13d0;
        uVar15 = uStack_13c8;
        (**(code **)(*local_1f80 + 0x18))(local_1f80,local_1fa0);
      }
    }
  }
  *ppvVar79 = (void *)0x0;
  ppvVar79[2] = (void *)0x0;
  *(undefined4 *)(ppvVar79 + 3) = 0;
  *(undefined4 *)(ppvVar79 + 5) = 0;
  *(undefined4 *)((long)ppvVar79 + 0x2c) = 0;
  *(undefined4 *)(ppvVar79 + 6) = 0;
  *(undefined4 *)((long)ppvVar79 + 0x34) = 0;
  *(undefined4 *)(ppvVar79 + 7) = 0;
  ppvVar79[8] = (void *)0x0;
  ppvVar79[1] = (void *)0x0;
  return local_1f1c;
}

Assistant:

int LRN_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    size_t elemsize = bottom_top_blob.elemsize;
    int size = w * h;

    // squared values with local_size padding
    Mat square_blob;
    square_blob.create(w, h, channels, elemsize, opt.workspace_allocator);
    if (square_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = bottom_top_blob.channel(q);
        float* outptr = square_blob.channel(q);

        int i = 0;
#if __AVX__
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = _mm256_mul_ps(_p, _p);
            _mm256_storeu_ps(outptr, _outp);

            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < size; i++)
        {
            *outptr = *ptr * *ptr;

            ptr++;
            outptr++;
        }
    }

    if (region_type == NormRegion_ACROSS_CHANNELS)
    {
        Mat square_sum;
        square_sum.create(w, h, channels, elemsize, opt.workspace_allocator);
        if (square_sum.empty())
            return -100;
        square_sum.fill(0.f);

        const float alpha_div_size = alpha / local_size;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            // square sum
            for (int p = q - local_size / 2; p <= q + local_size / 2; p++)
            {
                if (p < 0 || p >= channels)
                    continue;

                const float* sptr = square_blob.channel(p);
                float* ssptr = square_sum.channel(q);

                int i = 0;
#if __AVX__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _sp = _mm256_loadu_ps(sptr);
                    __m256 _ssp = _mm256_loadu_ps(ssptr);
                    _ssp = _mm256_add_ps(_ssp, _sp);
                    _mm256_storeu_ps(ssptr, _ssp);

                    sptr += 8;
                    ssptr += 8;
                }
#endif // __AVX__
                for (; i < size; i++)
                {
                    *ssptr += *sptr;
                    sptr++;
                    ssptr++;
                }
            }

            float* ptr = bottom_top_blob.channel(q);
            float* ssptr = square_sum.channel(q);

            int i = 0;
#if __AVX__
            __m256 _bias = _mm256_set1_ps(bias);
            __m256 _ads = _mm256_set1_ps(alpha_div_size);
            __m256 _mb = _mm256_set1_ps(-beta);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ssp = _mm256_loadu_ps(ssptr);
                _ssp = _mm256_mul_ps(_ssp, _ads);
                _ssp = _mm256_add_ps(_ssp, _bias);
                _ssp = pow256_ps(_ssp, _mb);
                _p = _mm256_mul_ps(_p, _ssp);
                _mm256_storeu_ps(ptr, _p);

                ssptr += 8;
                ptr += 8;
            }
#endif // __AVX__
            for (; i < size; i++)
            {
                *ptr = *ptr * powf(bias + alpha_div_size * *ssptr, -beta);

                ssptr++;
                ptr++;
            }
        }
    }
    else if (region_type == NormRegion_WITHIN_CHANNEL)
    {
        int outw = w;
        int outh = h;

        Mat square_blob_bordered = square_blob;
        int pad = local_size / 2;
        if (pad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border(square_blob, square_blob_bordered, pad, local_size - pad - 1, pad, local_size - pad - 1, BORDER_CONSTANT, 0.f, opt_b);
            if (square_blob_bordered.empty())
                return -100;

            w = square_blob_bordered.w;
            h = square_blob_bordered.h;
        }

        const int maxk = local_size * local_size;

        const float alpha_div_size = alpha / maxk;

        // norm window offsets
        std::vector<int> _space_ofs(maxk);
        int* space_ofs = &_space_ofs[0];
        {
            int p1 = 0;
            int p2 = 0;
            int gap = w - local_size;
            for (int i = 0; i < local_size; i++)
            {
                for (int j = 0; j < local_size; j++)
                {
                    space_ofs[p1] = p2;
                    p1++;
                    p2++;
                }
                p2 += gap;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            const Mat m = square_blob_bordered.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i) + j;

                    float ss = 0.f;

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        ss += val;
                    }

                    ptr[j] = ptr[j] * powf(bias + alpha_div_size * ss, -beta);
                }

                ptr += outw;
            }
        }
    }

    return 0;
}